

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  stbi__uint32 *y_00;
  int *comp_00;
  anon_struct_96_18_0d0905d3 *paVar1;
  undefined8 *puVar2;
  byte bVar3;
  uchar uVar4;
  short sVar5;
  stbi__uint32 sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  byte bVar28;
  short sVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined4 z;
  undefined4 z_00;
  undefined4 z_01;
  stbi_uc sVar36;
  byte bVar37;
  bool bVar38;
  int iVar39;
  uint uVar40;
  int iVar41;
  stbi__uint32 sVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  void *pvVar46;
  stbi__jpeg *psVar47;
  stbi__uint16 *psVar48;
  stbi__context *psVar49;
  uchar *puVar50;
  code *pcVar51;
  undefined8 *puVar52;
  uchar *puVar53;
  uint uVar54;
  byte *pbVar55;
  long lVar56;
  undefined8 *puVar57;
  stbi_uc *psVar58;
  undefined7 uVar59;
  int extraout_EDX;
  int why;
  int why_00;
  uint uVar60;
  stbi__jpeg *extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar61;
  stbi__jpeg *extraout_RDX_01;
  undefined8 extraout_RDX_02;
  stbi__jpeg *extraout_RDX_03;
  stbi__jpeg *extraout_RDX_04;
  stbi__jpeg *extraout_RDX_05;
  stbi__jpeg *extraout_RDX_06;
  stbi__jpeg *extraout_RDX_07;
  stbi__jpeg *extraout_RDX_08;
  stbi__jpeg *psVar62;
  stbi__jpeg *extraout_RDX_09;
  stbi__jpeg *extraout_RDX_10;
  stbi__jpeg *extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  ulong extraout_RDX_14;
  ulong extraout_RDX_15;
  stbi_uc *psVar63;
  long lVar64;
  stbi__context *s_00;
  undefined8 *puVar65;
  byte *pbVar66;
  ulong uVar67;
  int iVar68;
  stbi__uint32 sVar69;
  uint uVar70;
  short *psVar71;
  ulong uVar72;
  uint uVar73;
  anon_struct_96_18_0d0905d3 *paVar74;
  stbi_uc *psVar75;
  ulong uVar76;
  bool bVar77;
  undefined1 auVar78 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  int iVar113;
  int iVar117;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar118 [16];
  stbi_uc *coutput [4];
  stbi_uc pal [256] [4];
  uint local_538;
  int local_4e4;
  uint local_4c0;
  undefined1 local_4b8 [12];
  uint uStack_4ac;
  undefined1 local_4a8 [16];
  int local_498;
  undefined4 local_490;
  int local_48c;
  int local_488;
  uint local_484;
  anon_struct_96_18_0d0905d3 *local_480;
  uint local_474;
  ulong local_470;
  ulong local_468;
  uint *local_460;
  int local_458;
  int local_454;
  int local_450;
  int local_44c;
  ulong local_448;
  ulong local_440;
  stbi__png local_438;
  int aiStack_410 [248];
  
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  iVar41 = req_comp;
  iVar39 = stbi__check_png_header(s);
  psVar75 = s->img_buffer_original;
  s->img_buffer = psVar75;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar39 != 0) {
    if (4 < (uint)req_comp) {
      stbi__g_failure_reason = "bad req_comp";
      return (void *)0x0;
    }
    local_438.s = s;
    iVar41 = stbi__parse_png_file(&local_438,0,req_comp);
    psVar49 = local_438.s;
    if (iVar41 == 0) {
      psVar48 = (stbi__uint16 *)0x0;
    }
    else {
      iVar41 = 8;
      if ((8 < local_438.depth) && (iVar41 = 0x10, local_438.depth != 0x10)) {
        stbi__g_failure_reason = "bad bits_per_channel";
        return (void *)0x0;
      }
      ri->bits_per_channel = iVar41;
      psVar48 = (stbi__uint16 *)local_438.out;
      if ((req_comp != 0) && (iVar41 = (local_438.s)->img_out_n, iVar41 != req_comp)) {
        if (local_438.depth < 9) {
          psVar48 = (stbi__uint16 *)
                    stbi__convert_format
                              (local_438.out,iVar41,req_comp,(local_438.s)->img_x,
                               (local_438.s)->img_y);
        }
        else {
          psVar48 = stbi__convert_format16
                              ((stbi__uint16 *)local_438.out,iVar41,req_comp,(local_438.s)->img_x,
                               (local_438.s)->img_y);
        }
        psVar49->img_out_n = req_comp;
        if (psVar48 == (stbi__uint16 *)0x0) {
          return (void *)0x0;
        }
      }
      *x = psVar49->img_x;
      *y = psVar49->img_y;
      if (comp != (int *)0x0) {
        *comp = psVar49->img_n;
      }
      local_438.out = (stbi_uc *)0x0;
    }
    free(local_438.out);
    free(local_438.expanded);
    psVar47 = (stbi__jpeg *)local_438.idata;
    goto LAB_0017127b;
  }
  local_460 = (uint *)x;
  if (psVar75 < s->img_buffer_original_end) {
LAB_0016eab0:
    psVar58 = psVar75 + 1;
    s->img_buffer = psVar58;
    if (*psVar75 != 'B') goto LAB_0016ec41;
    if (s->img_buffer_end <= psVar58) {
      if (s->read_from_callbacks == 0) goto LAB_0016ec41;
      stbi__refill_buffer(s);
      psVar58 = s->img_buffer;
    }
    s->img_buffer = psVar58 + 1;
    if (*psVar58 != 'M') goto LAB_0016ec41;
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    uVar40 = stbi__get16le(s);
    iVar39 = stbi__get16le(s);
    uVar40 = iVar39 << 0x10 | uVar40;
    if (((0x38 < uVar40) || ((0x100010000001000U >> ((ulong)uVar40 & 0x3f) & 1) == 0)) &&
       (uVar40 != 0x6c)) {
      psVar58 = s->img_buffer_original;
      psVar75 = s->img_buffer_original_end;
      s->img_buffer = psVar58;
      s->img_buffer_end = psVar75;
      if (uVar40 == 0x7c) goto LAB_0016eb72;
      goto LAB_0016ec5d;
    }
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
LAB_0016eb72:
    local_4a8._12_4_ = 0xff;
    pvVar46 = stbi__bmp_parse_header(s,(stbi__bmp_data *)local_4b8);
    if (pvVar46 == (void *)0x0) {
      return (void *)0x0;
    }
    local_474 = s->img_y;
    uVar40 = -local_474;
    if (0 < (int)local_474) {
      uVar40 = local_474;
    }
    s->img_y = uVar40;
    if ((uVar40 < 0x1000001) && (s->img_x < 0x1000001)) {
      z = local_4a8._0_4_;
      z_00 = local_4a8._4_4_;
      z_01 = local_4a8._8_4_;
      local_538 = local_4a8._12_4_;
      if (local_4b8._8_4_ == 0xc) {
        if (0x17 < (int)local_4b8._0_4_) goto LAB_0017053e;
        uVar40 = ((local_4b8._4_4_ - local_498) + -0x18) / 3;
LAB_0017045d:
        if (uVar40 == 0) goto LAB_0017053e;
        bVar77 = false;
LAB_0017048b:
        uVar60 = uVar40;
        bVar38 = z_01 == 0xff000000;
        iVar41 = 4 - (uint)(z_01 == 0);
        iVar39 = local_4b8._0_4_;
      }
      else {
        if ((int)local_4b8._0_4_ < 0x10) {
          uVar40 = local_4b8._4_4_ - (local_498 + local_4b8._8_4_) >> 2;
          goto LAB_0017045d;
        }
LAB_0017053e:
        iVar41 = (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original) +
                 s->callback_already_read;
        if (iVar41 - 0x401U < 0xfffffc00) {
          stbi__g_failure_reason = "bad header";
          return (void *)0x0;
        }
        if (((int)local_4b8._4_4_ < iVar41) || (0x400 < local_4b8._4_4_ - iVar41)) {
          stbi__g_failure_reason = "bad offset";
          return (void *)0x0;
        }
        stbi__skip(s,local_4b8._4_4_ - iVar41);
        uVar60 = 0;
        bVar38 = true;
        uVar40 = 0;
        bVar77 = bVar38;
        if (local_4b8._0_4_ != 0x18 || z_01 != 0xff000000) goto LAB_0017048b;
        iVar41 = 3;
        iVar39 = 0x18;
        bVar77 = true;
      }
      s->img_n = iVar41;
      if (2 < req_comp) {
        iVar41 = req_comp;
      }
      sVar42 = s->img_x;
      sVar6 = s->img_y;
      iVar44 = stbi__mad3sizes_valid(iVar41,sVar42,sVar6,0);
      if (iVar44 != 0) {
        uVar76 = 0;
        puVar50 = (uchar *)stbi__malloc_mad3(iVar41,sVar42,sVar6,0);
        if (puVar50 == (uchar *)0x0) goto LAB_00170528;
        if (iVar39 < 0x10) {
          if (bVar77 || 0x100 < (int)uVar60) {
            free(puVar50);
            stbi__g_failure_reason = "invalid";
            return (void *)0x0;
          }
          if (0 < (int)uVar60) {
            psVar58 = s->img_buffer;
            uVar76 = 0;
            psVar75 = psVar58;
            do {
              psVar63 = s->img_buffer_end;
              if (psVar58 < psVar63) {
LAB_0017110c:
                psVar75 = psVar58 + 1;
                s->img_buffer = psVar75;
                sVar36 = *psVar58;
                psVar58 = psVar75;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  psVar58 = s->img_buffer;
                  psVar63 = s->img_buffer_end;
                  goto LAB_0017110c;
                }
                sVar36 = '\0';
              }
              *(stbi_uc *)((long)&local_438.s + uVar76 * 4 + 2) = sVar36;
              if (psVar58 < psVar63) {
LAB_0017114b:
                psVar75 = psVar58 + 1;
                s->img_buffer = psVar75;
                sVar36 = *psVar58;
                psVar58 = psVar75;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  psVar58 = s->img_buffer;
                  psVar63 = s->img_buffer_end;
                  goto LAB_0017114b;
                }
                sVar36 = '\0';
              }
              *(stbi_uc *)((long)&local_438.s + uVar76 * 4 + 1) = sVar36;
              if (psVar58 < psVar63) {
LAB_00171183:
                psVar75 = psVar58 + 1;
                s->img_buffer = psVar75;
                sVar36 = *psVar58;
                psVar58 = psVar75;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  psVar58 = s->img_buffer;
                  goto LAB_00171183;
                }
                sVar36 = '\0';
              }
              *(stbi_uc *)((long)&local_438.s + uVar76 * 4) = sVar36;
              if (local_4b8._8_4_ != 0xc) {
                if (s->img_buffer_end <= psVar75) {
                  psVar58 = psVar75;
                  if (s->read_from_callbacks == 0) goto LAB_001711cf;
                  stbi__refill_buffer(s);
                  psVar75 = s->img_buffer;
                }
                psVar58 = psVar75 + 1;
                s->img_buffer = psVar58;
                psVar75 = psVar58;
              }
LAB_001711cf:
              *(undefined1 *)((long)&local_438.s + uVar76 * 4 + 3) = 0xff;
              uVar76 = uVar76 + 1;
            } while (uVar60 != uVar76);
          }
          stbi__skip(s,(uVar60 * (local_4b8._8_4_ == 0xc | 0xfffffffc) + local_4b8._4_4_) -
                       (local_4b8._8_4_ + local_498));
          if (iVar39 == 1) {
            sVar42 = s->img_y;
            if (0 < (int)sVar42) {
              sVar6 = s->img_x;
              iVar39 = 0;
              iVar44 = 0;
              do {
                pbVar66 = s->img_buffer;
                if (pbVar66 < s->img_buffer_end) {
LAB_00171a35:
                  s->img_buffer = pbVar66 + 1;
                  uVar40 = (uint)*pbVar66;
                  pbVar66 = pbVar66 + 1;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    pbVar66 = s->img_buffer;
                    goto LAB_00171a35;
                  }
                  uVar40 = 0;
                }
                sVar42 = s->img_x;
                if (0 < (int)sVar42) {
                  sVar69 = 0;
                  uVar60 = 7;
                  do {
                    uVar72 = (ulong)((uVar40 >> (uVar60 & 0x1f) & 1) != 0);
                    lVar64 = (long)iVar39;
                    uVar76 = lVar64 + 3;
                    puVar50[lVar64] = *(uchar *)((long)&local_438.s + uVar72 * 4);
                    puVar50[lVar64 + 1] = *(uchar *)((long)&local_438.s + uVar72 * 4 + 1);
                    puVar50[lVar64 + 2] = *(uchar *)((long)&local_438.s + uVar72 * 4 + 2);
                    if (iVar41 == 4) {
                      puVar50[uVar76] = 0xff;
                      uVar76 = (ulong)(iVar39 + 4);
                    }
                    iVar39 = (int)uVar76;
                    sVar69 = sVar69 + 1;
                    if (sVar69 == sVar42) break;
                    if ((int)uVar60 < 1) {
                      if (s->img_buffer_end <= pbVar66) {
                        if (s->read_from_callbacks == 0) {
                          uVar40 = 0;
                          uVar60 = 7;
                          goto LAB_00171af6;
                        }
                        stbi__refill_buffer(s);
                        pbVar66 = s->img_buffer;
                        sVar42 = s->img_x;
                      }
                      s->img_buffer = pbVar66 + 1;
                      uVar40 = (uint)*pbVar66;
                      uVar60 = 7;
                      pbVar66 = pbVar66 + 1;
                    }
                    else {
                      uVar60 = uVar60 - 1;
                    }
LAB_00171af6:
                  } while ((int)sVar69 < (int)sVar42);
                }
                stbi__skip(s,-(sVar6 + 7 >> 3) & 3);
                iVar44 = iVar44 + 1;
                sVar42 = s->img_y;
              } while (iVar44 < (int)sVar42);
            }
          }
          else {
            if (iVar39 == 8) {
              uVar40 = s->img_x;
            }
            else {
              if (iVar39 != 4) {
                free(puVar50);
                stbi__g_failure_reason = "bad bpp";
                return (void *)0x0;
              }
              uVar40 = s->img_x + 1 >> 1;
            }
            sVar42 = s->img_y;
            if (0 < (int)sVar42) {
              uVar76 = 0;
              iVar44 = 0;
              do {
                if (0 < (int)s->img_x) {
                  pbVar66 = s->img_buffer;
                  iVar68 = 0;
                  do {
                    if (pbVar66 < s->img_buffer_end) {
LAB_001718b1:
                      s->img_buffer = pbVar66 + 1;
                      uVar60 = (uint)*pbVar66;
                      pbVar66 = pbVar66 + 1;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        pbVar66 = s->img_buffer;
                        goto LAB_001718b1;
                      }
                      uVar60 = 0;
                    }
                    uVar54 = uVar60 & 0xf;
                    uVar70 = uVar60 >> 4;
                    if (iVar39 != 4) {
                      uVar70 = uVar60;
                    }
                    uVar72 = (ulong)uVar70;
                    if (iVar39 != 4) {
                      uVar54 = 0;
                    }
                    lVar64 = (long)(int)uVar76;
                    uVar67 = lVar64 + 3;
                    puVar50[lVar64] = *(uchar *)((long)&local_438.s + uVar72 * 4);
                    puVar50[lVar64 + 1] = *(uchar *)((long)&local_438.s + uVar72 * 4 + 1);
                    puVar50[lVar64 + 2] = *(uchar *)((long)&local_438.s + uVar72 * 4 + 2);
                    if (iVar41 == 4) {
                      puVar50[uVar67] = 0xff;
                      uVar67 = (ulong)((int)uVar76 + 4);
                    }
                    if (iVar68 + 1U == s->img_x) {
                      uVar76 = uVar67 & 0xffffffff;
                      break;
                    }
                    if (iVar39 == 8) {
                      if (s->img_buffer_end <= pbVar66) {
                        if (s->read_from_callbacks == 0) {
                          uVar54 = 0;
                          goto LAB_0017196c;
                        }
                        stbi__refill_buffer(s);
                        pbVar66 = s->img_buffer;
                      }
                      s->img_buffer = pbVar66 + 1;
                      uVar54 = (uint)*pbVar66;
                      pbVar66 = pbVar66 + 1;
                    }
LAB_0017196c:
                    lVar64 = (long)(int)uVar67;
                    uVar76 = lVar64 + 3;
                    uVar72 = (ulong)uVar54;
                    puVar50[lVar64] = *(uchar *)((long)&local_438.s + uVar72 * 4);
                    puVar50[lVar64 + 1] = *(uchar *)((long)&local_438.s + uVar72 * 4 + 1);
                    puVar50[lVar64 + 2] = *(uchar *)((long)&local_438.s + uVar72 * 4 + 2);
                    if (iVar41 == 4) {
                      puVar50[uVar76] = 0xff;
                      uVar76 = (ulong)((int)uVar67 + 4);
                    }
                    iVar68 = iVar68 + 2;
                  } while (iVar68 < (int)s->img_x);
                }
                stbi__skip(s,-uVar40 & 3);
                iVar44 = iVar44 + 1;
                sVar42 = s->img_y;
              } while (iVar44 < (int)sVar42);
            }
          }
          goto LAB_00171b42;
        }
        stbi__skip(s,local_4b8._4_4_ - (local_4b8._8_4_ + local_498));
        if (iVar39 == 0x10) {
          local_4c0 = s->img_x * 2 & 2;
LAB_00171312:
          uVar59 = (undefined7)(uVar76 >> 8);
          if ((z == 0 || uStack_4ac == 0) || z_00 == 0) {
LAB_001713ce:
            free(puVar50);
            stbi__g_failure_reason = "bad masks";
            return (void *)0x0;
          }
          iVar44 = stbi__high_bit(uStack_4ac);
          uVar60 = stbi__bitcount(uStack_4ac);
          iVar68 = stbi__high_bit(z);
          iVar45 = stbi__bitcount(z);
          local_480 = (anon_struct_96_18_0d0905d3 *)CONCAT44(local_480._4_4_,iVar45);
          iVar45 = stbi__high_bit(z_00);
          uVar70 = stbi__bitcount(z_00);
          local_48c = stbi__high_bit(z_01);
          uVar40 = (uint)local_480;
          uVar54 = stbi__bitcount(z_01);
          if ((8 < uVar70 || (8 < uVar40 || 8 < uVar60)) || 8 < uVar54) goto LAB_001713ce;
          iVar44 = iVar44 + -7;
          iVar68 = iVar68 + -7;
          iVar45 = iVar45 + -7;
          iVar113 = local_48c + -7;
          local_490 = (undefined4)CONCAT71(uVar59,1);
          bVar77 = false;
        }
        else {
          if (iVar39 == 0x20) {
            uVar40 = z ^ 0xff00 | z_00 ^ 0xff;
            uVar76 = (ulong)uVar40;
            local_4c0 = 0;
            if (!(bool)((uStack_4ac == 0xff0000 && uVar40 == 0) & bVar38)) goto LAB_00171312;
            bVar77 = true;
          }
          else {
            local_4c0 = 0;
            if (iVar39 != 0x18) goto LAB_00171312;
            local_4c0 = s->img_x & 3;
            bVar77 = false;
          }
          local_490 = 0;
          iVar44 = 0;
          iVar68 = 0;
          iVar45 = 0;
          iVar113 = 0;
          uVar60 = 0;
          uVar40 = 0;
          uVar70 = 0;
          uVar54 = 0;
        }
        sVar42 = s->img_y;
        if (0 < (int)sVar42) {
          local_480 = (anon_struct_96_18_0d0905d3 *)CONCAT44(local_480._4_4_,8 - uVar60);
          local_484 = -iVar68;
          local_488 = -iVar45;
          local_44c = 8 - uVar70;
          local_454 = -iVar113;
          local_450 = 8 - uVar54;
          uVar76 = 0;
          local_470 = (ulong)(uVar60 << 2);
          local_468 = (ulong)(uVar40 << 2);
          local_440 = (ulong)(uVar70 << 2);
          local_448 = (ulong)(uVar54 << 2);
          iVar117 = 0;
          local_48c = iVar113;
          do {
            uVar72 = uVar76;
            local_458 = iVar117;
            if ((char)local_490 == '\0') {
              if (0 < (int)s->img_x) {
                pbVar66 = s->img_buffer;
                iVar113 = 0;
                do {
                  pbVar55 = s->img_buffer_end;
                  if (pbVar66 < pbVar55) {
LAB_001716d4:
                    s->img_buffer = pbVar66 + 1;
                    bVar37 = *pbVar66;
                    pbVar66 = pbVar66 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar66 = s->img_buffer;
                      pbVar55 = s->img_buffer_end;
                      goto LAB_001716d4;
                    }
                    bVar37 = 0;
                  }
                  lVar64 = (long)(int)uVar76;
                  puVar50[lVar64 + 2] = bVar37;
                  if (pbVar66 < pbVar55) {
LAB_00171717:
                    s->img_buffer = pbVar66 + 1;
                    bVar37 = *pbVar66;
                    pbVar66 = pbVar66 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar66 = s->img_buffer;
                      pbVar55 = s->img_buffer_end;
                      goto LAB_00171717;
                    }
                    bVar37 = 0;
                  }
                  puVar50[lVar64 + 1] = bVar37;
                  if (pbVar66 < pbVar55) {
LAB_00171750:
                    s->img_buffer = pbVar66 + 1;
                    bVar37 = *pbVar66;
                    pbVar66 = pbVar66 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar66 = s->img_buffer;
                      goto LAB_00171750;
                    }
                    bVar37 = 0;
                  }
                  puVar50[lVar64] = bVar37;
                  bVar37 = 0xff;
                  if (bVar77) {
                    if (s->img_buffer_end <= pbVar66) {
                      if (s->read_from_callbacks == 0) {
                        bVar37 = 0;
                        goto LAB_001717a2;
                      }
                      stbi__refill_buffer(s);
                      pbVar66 = s->img_buffer;
                    }
                    s->img_buffer = pbVar66 + 1;
                    bVar37 = *pbVar66;
                    pbVar66 = pbVar66 + 1;
                  }
LAB_001717a2:
                  uVar72 = lVar64 + 3;
                  if (iVar41 == 4) {
                    puVar50[uVar72] = bVar37;
                    uVar72 = (ulong)((int)uVar76 + 4);
                  }
                  local_538 = local_538 | bVar37;
                  iVar113 = iVar113 + 1;
                  uVar76 = uVar72 & 0xffffffff;
                } while (iVar113 < (int)s->img_x);
              }
            }
            else if (0 < (int)s->img_x) {
              iVar113 = 0;
              do {
                uVar60 = stbi__get16le(s);
                if (iVar39 != 0x10) {
                  iVar117 = stbi__get16le(s);
                  uVar60 = uVar60 | iVar117 << 0x10;
                }
                uVar70 = (uVar60 & uStack_4ac) >> ((byte)iVar44 & 0x1f);
                if (iVar44 < 0) {
                  uVar70 = (uVar60 & uStack_4ac) << (-(byte)iVar44 & 0x1f);
                }
                uVar54 = (uVar60 & z) >> ((byte)iVar68 & 0x1f);
                if (iVar68 < 0) {
                  uVar54 = (uVar60 & z) << ((byte)local_484 & 0x1f);
                }
                iVar117 = *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table + local_468);
                bVar37 = stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_468];
                uVar73 = (uVar60 & z_00) >> ((byte)iVar45 & 0x1f);
                if (iVar45 < 0) {
                  uVar73 = (uVar60 & z_00) << ((byte)local_488 & 0x1f);
                }
                lVar64 = (long)(int)uVar76;
                iVar43 = *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table + local_440);
                bVar3 = stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_440];
                puVar50[lVar64] =
                     (uchar)((int)((uVar70 >> ((byte)local_480 & 0x1f)) *
                                  *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                          local_470)) >>
                            (stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_470] & 0x1f)
                            );
                puVar50[lVar64 + 1] =
                     (uchar)((int)((uVar54 >> (8U - (char)uVar40 & 0x1f)) * iVar117) >>
                            (bVar37 & 0x1f));
                puVar50[lVar64 + 2] =
                     (uchar)((int)((uVar73 >> ((byte)local_44c & 0x1f)) * iVar43) >> (bVar3 & 0x1f))
                ;
                if (z_01 == 0) {
                  uVar60 = 0xff;
                }
                else {
                  uVar70 = (uVar60 & z_01) >> ((byte)local_48c & 0x1f);
                  if (local_48c < 0) {
                    uVar70 = (uVar60 & z_01) << ((byte)local_454 & 0x1f);
                  }
                  uVar60 = (int)((uVar70 >> ((byte)local_450 & 0x1f)) *
                                *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                        local_448)) >>
                           (stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_448] & 0x1f);
                }
                uVar72 = lVar64 + 3;
                if (iVar41 == 4) {
                  puVar50[uVar72] = (uchar)uVar60;
                  uVar72 = (ulong)((int)uVar76 + 4);
                }
                local_538 = local_538 | uVar60;
                iVar113 = iVar113 + 1;
                uVar76 = uVar72 & 0xffffffff;
              } while (iVar113 < (int)s->img_x);
            }
            stbi__skip(s,local_4c0);
            iVar117 = local_458 + 1;
            sVar42 = s->img_y;
            uVar76 = uVar72 & 0xffffffff;
          } while (iVar117 < (int)sVar42);
        }
LAB_00171b42:
        auVar35 = _DAT_00569880;
        auVar34 = _DAT_00569870;
        auVar33 = _DAT_00569860;
        auVar32 = _DAT_00569850;
        auVar31 = _DAT_005690b0;
        auVar30 = _DAT_005690a0;
        auVar118 = _DAT_00569090;
        if (((iVar41 == 4) && (local_538 == 0)) &&
           (uVar40 = s->img_x * sVar42 * 4 - 1, -1 < (int)uVar40)) {
          uVar60 = uVar40 >> 2;
          auVar78._4_4_ = 0;
          auVar78._0_4_ = uVar60;
          auVar78._8_4_ = uVar60;
          auVar78._12_4_ = 0;
          puVar53 = puVar50 + uVar40;
          uVar76 = 0;
          do {
            auVar96._8_4_ = (int)uVar76;
            auVar96._0_8_ = uVar76;
            auVar96._12_4_ = (int)(uVar76 >> 0x20);
            auVar98 = auVar78 | auVar31;
            auVar100 = (auVar96 | auVar30) ^ auVar31;
            iVar39 = auVar98._0_4_;
            iVar113 = -(uint)(iVar39 < auVar100._0_4_);
            iVar44 = auVar98._4_4_;
            auVar102._4_4_ = -(uint)(iVar44 < auVar100._4_4_);
            iVar68 = auVar98._8_4_;
            iVar117 = -(uint)(iVar68 < auVar100._8_4_);
            iVar45 = auVar98._12_4_;
            auVar102._12_4_ = -(uint)(iVar45 < auVar100._12_4_);
            auVar79._4_4_ = iVar113;
            auVar79._0_4_ = iVar113;
            auVar79._8_4_ = iVar117;
            auVar79._12_4_ = iVar117;
            auVar79 = pshuflw(in_XMM1,auVar79,0xe8);
            auVar101._4_4_ = -(uint)(auVar100._4_4_ == iVar44);
            auVar101._12_4_ = -(uint)(auVar100._12_4_ == iVar45);
            auVar101._0_4_ = auVar101._4_4_;
            auVar101._8_4_ = auVar101._12_4_;
            auVar88 = pshuflw(in_XMM2,auVar101,0xe8);
            auVar102._0_4_ = auVar102._4_4_;
            auVar102._8_4_ = auVar102._12_4_;
            auVar100 = pshuflw(auVar79,auVar102,0xe8);
            auVar98._8_4_ = 0xffffffff;
            auVar98._0_8_ = 0xffffffffffffffff;
            auVar98._12_4_ = 0xffffffff;
            auVar98 = (auVar100 | auVar88 & auVar79) ^ auVar98;
            auVar98 = packssdw(auVar98,auVar98);
            if ((auVar98 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *puVar53 = 0xff;
            }
            auVar88._4_4_ = iVar113;
            auVar88._0_4_ = iVar113;
            auVar88._8_4_ = iVar117;
            auVar88._12_4_ = iVar117;
            auVar102 = auVar101 & auVar88 | auVar102;
            auVar98 = packssdw(auVar102,auVar102);
            auVar100._8_4_ = 0xffffffff;
            auVar100._0_8_ = 0xffffffffffffffff;
            auVar100._12_4_ = 0xffffffff;
            auVar98 = packssdw(auVar98 ^ auVar100,auVar98 ^ auVar100);
            auVar98 = packsswb(auVar98,auVar98);
            if ((auVar98._0_4_ >> 8 & 1) != 0) {
              puVar53[-4] = 0xff;
            }
            auVar98 = (auVar96 | auVar118) ^ auVar31;
            auVar89._0_4_ = -(uint)(iVar39 < auVar98._0_4_);
            auVar89._4_4_ = -(uint)(iVar44 < auVar98._4_4_);
            auVar89._8_4_ = -(uint)(iVar68 < auVar98._8_4_);
            auVar89._12_4_ = -(uint)(iVar45 < auVar98._12_4_);
            auVar103._4_4_ = auVar89._0_4_;
            auVar103._0_4_ = auVar89._0_4_;
            auVar103._8_4_ = auVar89._8_4_;
            auVar103._12_4_ = auVar89._8_4_;
            iVar113 = -(uint)(auVar98._4_4_ == iVar44);
            iVar117 = -(uint)(auVar98._12_4_ == iVar45);
            auVar16._4_4_ = iVar113;
            auVar16._0_4_ = iVar113;
            auVar16._8_4_ = iVar117;
            auVar16._12_4_ = iVar117;
            auVar114._4_4_ = auVar89._4_4_;
            auVar114._0_4_ = auVar89._4_4_;
            auVar114._8_4_ = auVar89._12_4_;
            auVar114._12_4_ = auVar89._12_4_;
            auVar98 = auVar16 & auVar103 | auVar114;
            auVar98 = packssdw(auVar98,auVar98);
            auVar7._8_4_ = 0xffffffff;
            auVar7._0_8_ = 0xffffffffffffffff;
            auVar7._12_4_ = 0xffffffff;
            auVar98 = packssdw(auVar98 ^ auVar7,auVar98 ^ auVar7);
            auVar98 = packsswb(auVar98,auVar98);
            if ((auVar98._0_4_ >> 0x10 & 1) != 0) {
              puVar53[-8] = 0xff;
            }
            auVar98 = pshufhw(auVar98,auVar103,0x84);
            auVar17._4_4_ = iVar113;
            auVar17._0_4_ = iVar113;
            auVar17._8_4_ = iVar117;
            auVar17._12_4_ = iVar117;
            auVar100 = pshufhw(auVar89,auVar17,0x84);
            auVar79 = pshufhw(auVar98,auVar114,0x84);
            auVar80._8_4_ = 0xffffffff;
            auVar80._0_8_ = 0xffffffffffffffff;
            auVar80._12_4_ = 0xffffffff;
            auVar80 = (auVar79 | auVar100 & auVar98) ^ auVar80;
            auVar98 = packssdw(auVar80,auVar80);
            auVar98 = packsswb(auVar98,auVar98);
            if ((auVar98._0_4_ >> 0x18 & 1) != 0) {
              puVar53[-0xc] = 0xff;
            }
            auVar98 = (auVar96 | auVar35) ^ auVar31;
            auVar90._0_4_ = -(uint)(iVar39 < auVar98._0_4_);
            auVar90._4_4_ = -(uint)(iVar44 < auVar98._4_4_);
            auVar90._8_4_ = -(uint)(iVar68 < auVar98._8_4_);
            auVar90._12_4_ = -(uint)(iVar45 < auVar98._12_4_);
            auVar18._4_4_ = auVar90._0_4_;
            auVar18._0_4_ = auVar90._0_4_;
            auVar18._8_4_ = auVar90._8_4_;
            auVar18._12_4_ = auVar90._8_4_;
            auVar100 = pshuflw(auVar114,auVar18,0xe8);
            auVar81._0_4_ = -(uint)(auVar98._0_4_ == iVar39);
            auVar81._4_4_ = -(uint)(auVar98._4_4_ == iVar44);
            auVar81._8_4_ = -(uint)(auVar98._8_4_ == iVar68);
            auVar81._12_4_ = -(uint)(auVar98._12_4_ == iVar45);
            auVar104._4_4_ = auVar81._4_4_;
            auVar104._0_4_ = auVar81._4_4_;
            auVar104._8_4_ = auVar81._12_4_;
            auVar104._12_4_ = auVar81._12_4_;
            auVar98 = pshuflw(auVar81,auVar104,0xe8);
            auVar105._4_4_ = auVar90._4_4_;
            auVar105._0_4_ = auVar90._4_4_;
            auVar105._8_4_ = auVar90._12_4_;
            auVar105._12_4_ = auVar90._12_4_;
            auVar79 = pshuflw(auVar90,auVar105,0xe8);
            auVar8._8_4_ = 0xffffffff;
            auVar8._0_8_ = 0xffffffffffffffff;
            auVar8._12_4_ = 0xffffffff;
            auVar98 = packssdw(auVar98 & auVar100,(auVar79 | auVar98 & auVar100) ^ auVar8);
            auVar98 = packsswb(auVar98,auVar98);
            if ((auVar98 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              puVar53[-0x10] = 0xff;
            }
            auVar19._4_4_ = auVar90._0_4_;
            auVar19._0_4_ = auVar90._0_4_;
            auVar19._8_4_ = auVar90._8_4_;
            auVar19._12_4_ = auVar90._8_4_;
            auVar105 = auVar104 & auVar19 | auVar105;
            auVar79 = packssdw(auVar105,auVar105);
            auVar9._8_4_ = 0xffffffff;
            auVar9._0_8_ = 0xffffffffffffffff;
            auVar9._12_4_ = 0xffffffff;
            auVar98 = packssdw(auVar98,auVar79 ^ auVar9);
            auVar98 = packsswb(auVar98,auVar98);
            if ((auVar98._4_2_ >> 8 & 1) != 0) {
              puVar53[-0x14] = 0xff;
            }
            auVar98 = (auVar96 | auVar34) ^ auVar31;
            auVar91._0_4_ = -(uint)(iVar39 < auVar98._0_4_);
            auVar91._4_4_ = -(uint)(iVar44 < auVar98._4_4_);
            auVar91._8_4_ = -(uint)(iVar68 < auVar98._8_4_);
            auVar91._12_4_ = -(uint)(iVar45 < auVar98._12_4_);
            auVar106._4_4_ = auVar91._0_4_;
            auVar106._0_4_ = auVar91._0_4_;
            auVar106._8_4_ = auVar91._8_4_;
            auVar106._12_4_ = auVar91._8_4_;
            iVar113 = -(uint)(auVar98._4_4_ == iVar44);
            iVar117 = -(uint)(auVar98._12_4_ == iVar45);
            auVar20._4_4_ = iVar113;
            auVar20._0_4_ = iVar113;
            auVar20._8_4_ = iVar117;
            auVar20._12_4_ = iVar117;
            auVar115._4_4_ = auVar91._4_4_;
            auVar115._0_4_ = auVar91._4_4_;
            auVar115._8_4_ = auVar91._12_4_;
            auVar115._12_4_ = auVar91._12_4_;
            auVar98 = auVar20 & auVar106 | auVar115;
            auVar98 = packssdw(auVar98,auVar98);
            auVar10._8_4_ = 0xffffffff;
            auVar10._0_8_ = 0xffffffffffffffff;
            auVar10._12_4_ = 0xffffffff;
            auVar98 = packssdw(auVar98 ^ auVar10,auVar98 ^ auVar10);
            auVar98 = packsswb(auVar98,auVar98);
            if ((auVar98 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              puVar53[-0x18] = 0xff;
            }
            auVar98 = pshufhw(auVar98,auVar106,0x84);
            auVar21._4_4_ = iVar113;
            auVar21._0_4_ = iVar113;
            auVar21._8_4_ = iVar117;
            auVar21._12_4_ = iVar117;
            auVar100 = pshufhw(auVar91,auVar21,0x84);
            auVar79 = pshufhw(auVar98,auVar115,0x84);
            auVar82._8_4_ = 0xffffffff;
            auVar82._0_8_ = 0xffffffffffffffff;
            auVar82._12_4_ = 0xffffffff;
            auVar82 = (auVar79 | auVar100 & auVar98) ^ auVar82;
            auVar98 = packssdw(auVar82,auVar82);
            auVar98 = packsswb(auVar98,auVar98);
            if ((auVar98._6_2_ >> 8 & 1) != 0) {
              puVar53[-0x1c] = 0xff;
            }
            auVar98 = (auVar96 | auVar33) ^ auVar31;
            auVar92._0_4_ = -(uint)(iVar39 < auVar98._0_4_);
            auVar92._4_4_ = -(uint)(iVar44 < auVar98._4_4_);
            auVar92._8_4_ = -(uint)(iVar68 < auVar98._8_4_);
            auVar92._12_4_ = -(uint)(iVar45 < auVar98._12_4_);
            auVar22._4_4_ = auVar92._0_4_;
            auVar22._0_4_ = auVar92._0_4_;
            auVar22._8_4_ = auVar92._8_4_;
            auVar22._12_4_ = auVar92._8_4_;
            auVar100 = pshuflw(auVar115,auVar22,0xe8);
            auVar83._0_4_ = -(uint)(auVar98._0_4_ == iVar39);
            auVar83._4_4_ = -(uint)(auVar98._4_4_ == iVar44);
            auVar83._8_4_ = -(uint)(auVar98._8_4_ == iVar68);
            auVar83._12_4_ = -(uint)(auVar98._12_4_ == iVar45);
            auVar107._4_4_ = auVar83._4_4_;
            auVar107._0_4_ = auVar83._4_4_;
            auVar107._8_4_ = auVar83._12_4_;
            auVar107._12_4_ = auVar83._12_4_;
            auVar98 = pshuflw(auVar83,auVar107,0xe8);
            auVar108._4_4_ = auVar92._4_4_;
            auVar108._0_4_ = auVar92._4_4_;
            auVar108._8_4_ = auVar92._12_4_;
            auVar108._12_4_ = auVar92._12_4_;
            auVar79 = pshuflw(auVar92,auVar108,0xe8);
            auVar93._8_4_ = 0xffffffff;
            auVar93._0_8_ = 0xffffffffffffffff;
            auVar93._12_4_ = 0xffffffff;
            auVar93 = (auVar79 | auVar98 & auVar100) ^ auVar93;
            auVar79 = packssdw(auVar93,auVar93);
            auVar98 = packsswb(auVar98 & auVar100,auVar79);
            if ((auVar98 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar53[-0x20] = 0xff;
            }
            auVar23._4_4_ = auVar92._0_4_;
            auVar23._0_4_ = auVar92._0_4_;
            auVar23._8_4_ = auVar92._8_4_;
            auVar23._12_4_ = auVar92._8_4_;
            auVar108 = auVar107 & auVar23 | auVar108;
            auVar79 = packssdw(auVar108,auVar108);
            auVar11._8_4_ = 0xffffffff;
            auVar11._0_8_ = 0xffffffffffffffff;
            auVar11._12_4_ = 0xffffffff;
            auVar79 = packssdw(auVar79 ^ auVar11,auVar79 ^ auVar11);
            auVar98 = packsswb(auVar98,auVar79);
            if ((auVar98._8_2_ >> 8 & 1) != 0) {
              puVar53[-0x24] = 0xff;
            }
            auVar98 = (auVar96 | auVar32) ^ auVar31;
            auVar94._0_4_ = -(uint)(iVar39 < auVar98._0_4_);
            auVar94._4_4_ = -(uint)(iVar44 < auVar98._4_4_);
            auVar94._8_4_ = -(uint)(iVar68 < auVar98._8_4_);
            auVar94._12_4_ = -(uint)(iVar45 < auVar98._12_4_);
            auVar109._4_4_ = auVar94._0_4_;
            auVar109._0_4_ = auVar94._0_4_;
            auVar109._8_4_ = auVar94._8_4_;
            auVar109._12_4_ = auVar94._8_4_;
            iVar113 = -(uint)(auVar98._4_4_ == iVar44);
            iVar117 = -(uint)(auVar98._12_4_ == iVar45);
            auVar24._4_4_ = iVar113;
            auVar24._0_4_ = iVar113;
            auVar24._8_4_ = iVar117;
            auVar24._12_4_ = iVar117;
            auVar116._4_4_ = auVar94._4_4_;
            auVar116._0_4_ = auVar94._4_4_;
            auVar116._8_4_ = auVar94._12_4_;
            auVar116._12_4_ = auVar94._12_4_;
            auVar98 = auVar24 & auVar109 | auVar116;
            auVar98 = packssdw(auVar98,auVar98);
            auVar12._8_4_ = 0xffffffff;
            auVar12._0_8_ = 0xffffffffffffffff;
            auVar12._12_4_ = 0xffffffff;
            auVar98 = packssdw(auVar98 ^ auVar12,auVar98 ^ auVar12);
            auVar98 = packsswb(auVar98,auVar98);
            if ((auVar98 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              puVar53[-0x28] = 0xff;
            }
            auVar98 = pshufhw(auVar98,auVar109,0x84);
            auVar25._4_4_ = iVar113;
            auVar25._0_4_ = iVar113;
            auVar25._8_4_ = iVar117;
            auVar25._12_4_ = iVar117;
            auVar100 = pshufhw(auVar94,auVar25,0x84);
            auVar79 = pshufhw(auVar98,auVar116,0x84);
            auVar84._8_4_ = 0xffffffff;
            auVar84._0_8_ = 0xffffffffffffffff;
            auVar84._12_4_ = 0xffffffff;
            auVar84 = (auVar79 | auVar100 & auVar98) ^ auVar84;
            auVar98 = packssdw(auVar84,auVar84);
            auVar98 = packsswb(auVar98,auVar98);
            if ((auVar98._10_2_ >> 8 & 1) != 0) {
              puVar53[-0x2c] = 0xff;
            }
            auVar98 = (auVar96 | _DAT_00569840) ^ auVar31;
            auVar95._0_4_ = -(uint)(iVar39 < auVar98._0_4_);
            auVar95._4_4_ = -(uint)(iVar44 < auVar98._4_4_);
            auVar95._8_4_ = -(uint)(iVar68 < auVar98._8_4_);
            auVar95._12_4_ = -(uint)(iVar45 < auVar98._12_4_);
            auVar26._4_4_ = auVar95._0_4_;
            auVar26._0_4_ = auVar95._0_4_;
            auVar26._8_4_ = auVar95._8_4_;
            auVar26._12_4_ = auVar95._8_4_;
            auVar100 = pshuflw(auVar116,auVar26,0xe8);
            auVar85._0_4_ = -(uint)(auVar98._0_4_ == iVar39);
            auVar85._4_4_ = -(uint)(auVar98._4_4_ == iVar44);
            auVar85._8_4_ = -(uint)(auVar98._8_4_ == iVar68);
            auVar85._12_4_ = -(uint)(auVar98._12_4_ == iVar45);
            auVar110._4_4_ = auVar85._4_4_;
            auVar110._0_4_ = auVar85._4_4_;
            auVar110._8_4_ = auVar85._12_4_;
            auVar110._12_4_ = auVar85._12_4_;
            auVar98 = pshuflw(auVar85,auVar110,0xe8);
            auVar111._4_4_ = auVar95._4_4_;
            auVar111._0_4_ = auVar95._4_4_;
            auVar111._8_4_ = auVar95._12_4_;
            auVar111._12_4_ = auVar95._12_4_;
            auVar79 = pshuflw(auVar95,auVar111,0xe8);
            auVar13._8_4_ = 0xffffffff;
            auVar13._0_8_ = 0xffffffffffffffff;
            auVar13._12_4_ = 0xffffffff;
            auVar98 = packssdw(auVar98 & auVar100,(auVar79 | auVar98 & auVar100) ^ auVar13);
            auVar98 = packsswb(auVar98,auVar98);
            if ((auVar98 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              puVar53[-0x30] = 0xff;
            }
            auVar27._4_4_ = auVar95._0_4_;
            auVar27._0_4_ = auVar95._0_4_;
            auVar27._8_4_ = auVar95._8_4_;
            auVar27._12_4_ = auVar95._8_4_;
            auVar111 = auVar110 & auVar27 | auVar111;
            auVar79 = packssdw(auVar111,auVar111);
            auVar14._8_4_ = 0xffffffff;
            auVar14._0_8_ = 0xffffffffffffffff;
            auVar14._12_4_ = 0xffffffff;
            auVar98 = packssdw(auVar98,auVar79 ^ auVar14);
            auVar98 = packsswb(auVar98,auVar98);
            if ((auVar98._12_2_ >> 8 & 1) != 0) {
              puVar53[-0x34] = 0xff;
            }
            auVar98 = (auVar96 | _DAT_00569830) ^ auVar31;
            auVar86._0_4_ = -(uint)(iVar39 < auVar98._0_4_);
            auVar86._4_4_ = -(uint)(iVar44 < auVar98._4_4_);
            auVar86._8_4_ = -(uint)(iVar68 < auVar98._8_4_);
            auVar86._12_4_ = -(uint)(iVar45 < auVar98._12_4_);
            auVar112._4_4_ = auVar86._0_4_;
            auVar112._0_4_ = auVar86._0_4_;
            auVar112._8_4_ = auVar86._8_4_;
            auVar112._12_4_ = auVar86._8_4_;
            auVar97._4_4_ = -(uint)(auVar98._4_4_ == iVar44);
            auVar97._12_4_ = -(uint)(auVar98._12_4_ == iVar45);
            auVar97._0_4_ = auVar97._4_4_;
            auVar97._8_4_ = auVar97._12_4_;
            auVar99._4_4_ = auVar86._4_4_;
            auVar99._0_4_ = auVar86._4_4_;
            auVar99._8_4_ = auVar86._12_4_;
            auVar99._12_4_ = auVar86._12_4_;
            auVar79 = auVar97 & auVar112 | auVar99;
            auVar98 = packssdw(auVar86,auVar79);
            auVar15._8_4_ = 0xffffffff;
            auVar15._0_8_ = 0xffffffffffffffff;
            auVar15._12_4_ = 0xffffffff;
            auVar98 = packssdw(auVar98 ^ auVar15,auVar98 ^ auVar15);
            auVar98 = packsswb(auVar98,auVar98);
            if ((auVar98 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              puVar53[-0x38] = 0xff;
            }
            auVar98 = pshufhw(auVar98,auVar112,0x84);
            in_XMM2 = pshufhw(auVar79,auVar97,0x84);
            in_XMM2 = in_XMM2 & auVar98;
            auVar98 = pshufhw(auVar98,auVar99,0x84);
            auVar87._8_4_ = 0xffffffff;
            auVar87._0_8_ = 0xffffffffffffffff;
            auVar87._12_4_ = 0xffffffff;
            auVar87 = (auVar98 | in_XMM2) ^ auVar87;
            auVar98 = packssdw(auVar87,auVar87);
            in_XMM1 = packsswb(auVar98,auVar98);
            if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
              puVar53[-0x3c] = 0xff;
            }
            uVar76 = uVar76 + 0x10;
            puVar53 = puVar53 + -0x40;
          } while ((uVar60 + 0x10 & 0x3ffffff0) != uVar76);
        }
        if ((int)local_474 < 1) {
          uVar40 = s->img_x;
        }
        else {
          uVar40 = s->img_x;
          if (0 < (int)sVar42 >> 1) {
            uVar60 = uVar40 * iVar41;
            uVar70 = (sVar42 - 1) * uVar60;
            uVar76 = 0;
            uVar72 = 0;
            do {
              if (0 < (int)uVar60) {
                uVar67 = 0;
                do {
                  uVar4 = puVar50[uVar67 + uVar76];
                  puVar50[uVar67 + uVar76] = puVar50[uVar67 + uVar70];
                  puVar50[uVar67 + uVar70] = uVar4;
                  uVar67 = uVar67 + 1;
                } while (uVar60 != uVar67);
              }
              uVar72 = uVar72 + 1;
              uVar70 = uVar70 - uVar60;
              uVar76 = (ulong)((int)uVar76 + uVar60);
            } while (uVar72 != (uint)((int)sVar42 >> 1));
          }
        }
        if ((req_comp != 0) && (iVar41 != req_comp)) {
          puVar50 = stbi__convert_format(puVar50,iVar41,req_comp,uVar40,sVar42);
          if (puVar50 == (uchar *)0x0) {
            return (void *)0x0;
          }
          uVar40 = s->img_x;
        }
        *local_460 = uVar40;
        *y = s->img_y;
        if (comp != (int *)0x0) {
          *comp = s->img_n;
          return puVar50;
        }
        return puVar50;
      }
    }
LAB_0017051f:
    stbi__g_failure_reason = "too large";
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar75 = s->img_buffer;
      goto LAB_0016eab0;
    }
LAB_0016ec41:
    psVar58 = s->img_buffer_original;
    psVar75 = s->img_buffer_original_end;
    s->img_buffer = psVar58;
    s->img_buffer_end = psVar75;
LAB_0016ec5d:
    psVar47 = (stbi__jpeg *)calloc(1,0x4888);
    if (psVar47 == (stbi__jpeg *)0x0) {
      stbi__g_failure_reason = "outofmem";
    }
    else {
      psVar47->s = s;
      psVar47->idct_block_kernel = stbi__idct_simd;
      psVar47->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
      psVar47->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
      psVar47->app14_color_transform = -1;
      psVar47->marker = 0xff;
      sVar36 = stbi__get_marker(psVar47);
      if (sVar36 == 0xd8) {
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        free(psVar47);
        psVar47 = (stbi__jpeg *)calloc(1,0x4888);
        if (psVar47 == (stbi__jpeg *)0x0) goto LAB_00170528;
        psVar47->s = s;
        psVar47->idct_block_kernel = stbi__idct_simd;
        psVar47->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
        psVar47->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
        s->img_n = 0;
        if ((uint)req_comp < 5) {
          psVar47->img_comp[0].raw_data = (void *)0x0;
          psVar47->img_comp[0].raw_coeff = (void *)0x0;
          psVar47->img_comp[1].raw_data = (void *)0x0;
          psVar47->img_comp[1].raw_coeff = (void *)0x0;
          psVar47->img_comp[2].raw_data = (void *)0x0;
          psVar47->img_comp[2].raw_coeff = (void *)0x0;
          psVar47->img_comp[3].raw_data = (void *)0x0;
          psVar47->img_comp[3].raw_coeff = (void *)0x0;
          psVar47->restart_interval = 0;
          iVar41 = stbi__decode_jpeg_header(psVar47,0);
          psVar62 = extraout_RDX;
          if (iVar41 == 0) {
LAB_00171265:
            iVar41 = (int)psVar62;
            uVar40 = psVar47->s->img_n;
          }
          else {
            paVar1 = psVar47->img_comp;
            bVar37 = stbi__get_marker(psVar47);
            uVar61 = extraout_RDX_00;
LAB_0016f06b:
            iVar41 = (int)uVar61;
            if (bVar37 == 0xda) {
              iVar41 = stbi__get16be(psVar47->s);
              psVar49 = psVar47->s;
              pbVar66 = psVar49->img_buffer;
              psVar62 = extraout_RDX_03;
              if (pbVar66 < psVar49->img_buffer_end) {
LAB_0016f11e:
                psVar49->img_buffer = pbVar66 + 1;
                bVar37 = *pbVar66;
                psVar47->scan_n = (uint)bVar37;
                if (((byte)(bVar37 - 5) < 0xfc) ||
                   (psVar49 = psVar47->s, psVar49->img_n < (int)(uint)bVar37)) goto LAB_00171257;
                if (iVar41 == (uint)bVar37 * 2 + 6) {
                  lVar64 = 0;
                  s_00 = psVar49;
                  do {
                    pbVar55 = s_00->img_buffer;
                    pbVar66 = s_00->img_buffer_end;
                    if (pbVar55 < pbVar66) {
LAB_0016f193:
                      s_00->img_buffer = pbVar55 + 1;
                      uVar40 = (uint)*pbVar55;
                      pbVar55 = psVar49->img_buffer;
                      pbVar66 = psVar49->img_buffer_end;
                      s_00 = psVar49;
                    }
                    else {
                      if (s_00->read_from_callbacks != 0) {
                        stbi__refill_buffer(s_00);
                        pbVar55 = s_00->img_buffer;
                        psVar49 = psVar47->s;
                        goto LAB_0016f193;
                      }
                      uVar40 = 0;
                    }
                    if (pbVar55 < pbVar66) {
LAB_0016f1d9:
                      s_00->img_buffer = pbVar55 + 1;
                      bVar37 = *pbVar55;
                      s_00 = psVar49;
                    }
                    else {
                      if (s_00->read_from_callbacks != 0) {
                        stbi__refill_buffer(s_00);
                        pbVar55 = s_00->img_buffer;
                        psVar49 = psVar47->s;
                        goto LAB_0016f1d9;
                      }
                      bVar37 = 0;
                    }
                    iVar41 = s_00->img_n;
                    if ((long)iVar41 < 1) {
                      psVar62 = (stbi__jpeg *)0x0;
                    }
                    else {
                      psVar62 = (stbi__jpeg *)0x0;
                      paVar74 = paVar1;
                      while (paVar74->id != uVar40) {
                        psVar62 = (stbi__jpeg *)((long)&psVar62->s + 1);
                        paVar74 = paVar74 + 1;
                        if ((stbi__jpeg *)(long)iVar41 == psVar62) goto LAB_00171265;
                      }
                    }
                    if ((int)psVar62 == iVar41) goto LAB_00171265;
                    psVar47->img_comp[(ulong)psVar62 & 0xffffffff].hd = (uint)(bVar37 >> 4);
                    if (0x3f < bVar37) {
                      stbi__g_failure_reason = "bad DC huff";
                      goto LAB_00171265;
                    }
                    paVar1[(ulong)psVar62 & 0xffffffff].ha = bVar37 & 0xf;
                    if (3 < (bVar37 & 0xf)) {
                      stbi__g_failure_reason = "bad AC huff";
                      goto LAB_00171265;
                    }
                    psVar47->order[lVar64] = (int)psVar62;
                    lVar64 = lVar64 + 1;
                  } while (lVar64 < psVar47->scan_n);
                  pbVar55 = s_00->img_buffer;
                  pbVar66 = s_00->img_buffer_end;
                  if (pbVar55 < pbVar66) {
LAB_0016f2b2:
                    s_00->img_buffer = pbVar55 + 1;
                    uVar40 = (uint)*pbVar55;
                    pbVar55 = psVar49->img_buffer;
                    pbVar66 = psVar49->img_buffer_end;
                    s_00 = psVar49;
                  }
                  else {
                    if (s_00->read_from_callbacks != 0) {
                      stbi__refill_buffer(s_00);
                      pbVar55 = s_00->img_buffer;
                      psVar49 = psVar47->s;
                      goto LAB_0016f2b2;
                    }
                    uVar40 = 0;
                  }
                  psVar47->spec_start = uVar40;
                  if (pbVar55 < pbVar66) {
LAB_0016f2fe:
                    s_00->img_buffer = pbVar55 + 1;
                    uVar40 = (uint)*pbVar55;
                    pbVar55 = psVar49->img_buffer;
                    pbVar66 = psVar49->img_buffer_end;
                    s_00 = psVar49;
                  }
                  else {
                    if (s_00->read_from_callbacks != 0) {
                      stbi__refill_buffer(s_00);
                      pbVar55 = s_00->img_buffer;
                      psVar49 = psVar47->s;
                      goto LAB_0016f2fe;
                    }
                    uVar40 = 0;
                  }
                  psVar47->spec_end = uVar40;
                  if (pbVar55 < pbVar66) {
LAB_0016f347:
                    s_00->img_buffer = pbVar55 + 1;
                    uVar40 = (uint)*pbVar55;
                  }
                  else {
                    if (s_00->read_from_callbacks != 0) {
                      stbi__refill_buffer(s_00);
                      pbVar55 = s_00->img_buffer;
                      goto LAB_0016f347;
                    }
                    uVar40 = 0;
                  }
                  psVar47->succ_high = uVar40 >> 4;
                  uVar60 = uVar40 & 0xf;
                  psVar62 = (stbi__jpeg *)(ulong)uVar60;
                  psVar47->succ_low = uVar60;
                  iVar41 = psVar47->progressive;
                  iVar39 = psVar47->spec_start;
                  if (iVar41 == 0) {
                    if (iVar39 != 0 || uVar40 != 0) {
LAB_0017216b:
                      stbi__g_failure_reason = "bad SOS";
                      goto LAB_00171265;
                    }
                    psVar47->spec_end = 0x3f;
                  }
                  else if ((((0x3f < iVar39) || (0x3f < psVar47->spec_end)) ||
                           (psVar47->spec_end < iVar39)) || ((0xdf < uVar40 || (0xd < uVar60))))
                  goto LAB_0017216b;
                  uVar40 = psVar47->scan_n;
                  psVar62 = (stbi__jpeg *)(ulong)uVar40;
                  iVar39 = psVar47->restart_interval;
                  if (iVar39 == 0) {
                    iVar39 = 0x7fffffff;
                  }
                  psVar47->code_buffer = 0;
                  psVar47->code_bits = 0;
                  psVar47->nomore = 0;
                  psVar47->img_comp[3].dc_pred = 0;
                  psVar47->img_comp[2].dc_pred = 0;
                  psVar47->img_comp[1].dc_pred = 0;
                  psVar47->img_comp[0].dc_pred = 0;
                  psVar47->marker = 0xff;
                  psVar47->todo = iVar39;
                  psVar47->eob_run = 0;
                  if (iVar41 == 0) {
                    if (uVar40 == 1) {
                      iVar41 = psVar47->order[0];
                      iVar39 = psVar47->img_comp[iVar41].y + 7 >> 3;
                      bVar77 = true;
                      if (0 < iVar39) {
                        uVar40 = paVar1[iVar41].x + 7 >> 3;
                        iVar68 = 0;
                        iVar44 = 0;
                        do {
                          if (0 < (int)uVar40) {
                            lVar64 = 0;
                            do {
                              iVar45 = stbi__jpeg_decode_block
                                                 (psVar47,(short *)&local_438,
                                                  (stbi__huffman *)
                                                  psVar47->huff_dc[paVar1[iVar41].hd].fast,
                                                  (stbi__huffman *)
                                                  psVar47->huff_ac[paVar1[iVar41].ha].fast,
                                                  psVar47->fast_ac[paVar1[iVar41].ha],iVar41,
                                                  psVar47->dequant[paVar1[iVar41].tq]);
                              psVar62 = extraout_RDX_06;
                              if (iVar45 == 0) goto LAB_0017024f;
                              (*psVar47->idct_block_kernel)
                                        (paVar1[iVar41].data + lVar64 + iVar68 * paVar1[iVar41].w2,
                                         paVar1[iVar41].w2,(short *)&local_438);
                              iVar45 = psVar47->todo;
                              psVar47->todo = iVar45 + -1;
                              psVar62 = extraout_RDX_07;
                              if (iVar45 < 2) {
                                if (psVar47->code_bits < 0x18) {
                                  stbi__grow_buffer_unsafe(psVar47);
                                  psVar62 = extraout_RDX_08;
                                }
                                if ((psVar47->marker & 0xf8) != 0xd0) goto LAB_0016fe31;
                                psVar47->code_buffer = 0;
                                psVar47->code_bits = 0;
                                psVar47->nomore = 0;
                                psVar47->img_comp[3].dc_pred = 0;
                                psVar47->img_comp[2].dc_pred = 0;
                                psVar47->img_comp[1].dc_pred = 0;
                                psVar47->img_comp[0].dc_pred = 0;
                                psVar47->marker = 0xff;
                                iVar45 = psVar47->restart_interval;
                                psVar62 = (stbi__jpeg *)0x7fffffff;
                                if (iVar45 == 0) {
                                  iVar45 = 0x7fffffff;
                                }
                                psVar47->todo = iVar45;
                                psVar47->eob_run = 0;
                              }
                              lVar64 = lVar64 + 8;
                            } while ((ulong)uVar40 * 8 != lVar64);
                          }
                          iVar44 = iVar44 + 1;
                          iVar68 = iVar68 + 8;
                        } while (iVar44 != iVar39);
LAB_0016fe31:
                        bVar77 = true;
                      }
                    }
                    else {
                      psVar62 = (stbi__jpeg *)(ulong)(uint)psVar47->img_mcu_y;
                      bVar77 = true;
                      if (0 < psVar47->img_mcu_y) {
                        iVar41 = psVar47->img_mcu_x;
                        iVar44 = 0;
                        do {
                          if (0 < iVar41) {
                            iVar68 = 0;
                            do {
                              iVar41 = psVar47->scan_n;
                              if (0 < iVar41) {
                                lVar64 = 0;
                                do {
                                  iVar39 = psVar47->order[lVar64];
                                  iVar45 = psVar47->img_comp[iVar39].v;
                                  if (0 < iVar45) {
                                    iVar41 = paVar1[iVar39].h;
                                    iVar113 = 0;
                                    do {
                                      if (0 < iVar41) {
                                        iVar45 = 0;
                                        do {
                                          iVar117 = paVar1[iVar39].v;
                                          iVar43 = stbi__jpeg_decode_block
                                                             (psVar47,(short *)&local_438,
                                                              (stbi__huffman *)
                                                              psVar47->huff_dc[paVar1[iVar39].hd].
                                                              fast,(stbi__huffman *)
                                                                   psVar47->huff_ac
                                                                   [paVar1[iVar39].ha].fast,
                                                              psVar47->fast_ac[paVar1[iVar39].ha],
                                                              iVar39,psVar47->dequant
                                                                     [paVar1[iVar39].tq]);
                                          psVar62 = extraout_RDX_10;
                                          if (iVar43 == 0) goto LAB_0017024f;
                                          (*psVar47->idct_block_kernel)
                                                    (paVar1[iVar39].data +
                                                     (long)((iVar41 * iVar68 + iVar45) * 8) +
                                                     (long)((iVar117 * iVar44 + iVar113) *
                                                            paVar1[iVar39].w2 * 8),paVar1[iVar39].w2
                                                     ,(short *)&local_438);
                                          iVar45 = iVar45 + 1;
                                          iVar41 = paVar1[iVar39].h;
                                        } while (iVar45 < iVar41);
                                        iVar45 = paVar1[iVar39].v;
                                      }
                                      iVar113 = iVar113 + 1;
                                    } while (iVar113 < iVar45);
                                    iVar41 = psVar47->scan_n;
                                  }
                                  lVar64 = lVar64 + 1;
                                } while (lVar64 < iVar41);
                                iVar39 = psVar47->todo;
                              }
                              psVar47->todo = iVar39 + -1;
                              bVar77 = iVar39 < 2;
                              iVar39 = iVar39 + -1;
                              if (bVar77) {
                                psVar62 = psVar47;
                                if (psVar47->code_bits < 0x18) {
                                  stbi__grow_buffer_unsafe(psVar47);
                                  psVar62 = extraout_RDX_11;
                                }
                                if ((psVar47->marker & 0xf8) != 0xd0) goto LAB_0017023e;
                                psVar47->code_buffer = 0;
                                psVar47->code_bits = 0;
                                psVar47->nomore = 0;
                                psVar47->img_comp[3].dc_pred = 0;
                                psVar47->img_comp[2].dc_pred = 0;
                                psVar47->img_comp[1].dc_pred = 0;
                                psVar47->img_comp[0].dc_pred = 0;
                                psVar47->marker = 0xff;
                                iVar39 = psVar47->restart_interval;
                                if (iVar39 == 0) {
                                  iVar39 = 0x7fffffff;
                                }
                                psVar47->todo = iVar39;
                                psVar47->eob_run = 0;
                              }
                              iVar68 = iVar68 + 1;
                              iVar41 = psVar47->img_mcu_x;
                            } while (iVar68 < iVar41);
                            psVar62 = (stbi__jpeg *)(ulong)(uint)psVar47->img_mcu_y;
                          }
                          iVar44 = iVar44 + 1;
                        } while (iVar44 < (int)psVar62);
LAB_0017023e:
                        bVar77 = true;
                      }
                    }
                    goto LAB_00170261;
                  }
                  if (uVar40 == 1) {
                    local_468 = (ulong)psVar47->order[0];
                    local_488 = psVar47->img_comp[local_468].y + 7 >> 3;
                    if (0 < local_488) {
                      local_480 = paVar1 + local_468;
                      local_470 = CONCAT44(local_470._4_4_,psVar47->img_comp[local_468].x + 7 >> 3);
                      local_4e4 = 0;
                      do {
                        if (0 < (int)local_470) {
                          iVar41 = 0;
                          do {
                            psVar71 = local_480->coeff +
                                      (local_480->coeff_w * local_4e4 + iVar41) * 0x40;
                            uVar76 = (ulong)psVar47->spec_start;
                            if (uVar76 == 0) {
                              iVar39 = stbi__jpeg_decode_block_prog_dc
                                                 (psVar47,psVar71,
                                                  (stbi__huffman *)
                                                  psVar47->huff_dc[local_480->hd].fast,
                                                  (int)local_468);
                              psVar62 = extraout_RDX_05;
                              if (iVar39 == 0) goto LAB_00171265;
                            }
                            else {
                              iVar39 = local_480->ha;
                              iVar44 = psVar47->eob_run;
                              bVar37 = (byte)psVar47->succ_low;
                              if (psVar47->succ_high == 0) {
                                if (iVar44 == 0) {
                                  psVar62 = (stbi__jpeg *)(ulong)(uint)psVar47->code_bits;
                                  do {
                                    if ((int)psVar62 < 0x10) {
                                      stbi__grow_buffer_unsafe(psVar47);
                                    }
                                    uVar40 = psVar47->code_buffer;
                                    uVar72 = (ulong)(uVar40 >> 0x17);
                                    sVar5 = psVar47->fast_ac[iVar39][uVar72];
                                    uVar60 = (uint)sVar5;
                                    iVar44 = (int)uVar76;
                                    if (sVar5 == 0) {
                                      if (psVar47->code_bits < 0x10) {
                                        stbi__grow_buffer_unsafe(psVar47);
                                        uVar40 = psVar47->code_buffer;
                                        uVar72 = (ulong)(uVar40 >> 0x17);
                                      }
                                      uVar76 = (ulong)psVar47->huff_ac[iVar39].fast[uVar72];
                                      if (uVar76 == 0xff) {
                                        lVar64 = 0;
                                        do {
                                          lVar56 = lVar64;
                                          lVar64 = lVar56 + 1;
                                        } while (psVar47->huff_ac[iVar39].maxcode[lVar56 + 10] <=
                                                 uVar40 >> 0x10);
                                        uVar60 = psVar47->code_bits;
                                        psVar62 = (stbi__jpeg *)(ulong)uVar60;
                                        if (lVar64 == 8) goto LAB_00172177;
                                        if (((int)uVar60 < (int)(lVar56 + 10)) ||
                                           (uVar70 = (uVar40 >> (0x17U - (char)lVar64 & 0x1f) &
                                                     stbi__bmask[lVar56 + 10]) +
                                                     psVar47->huff_ac[iVar39].delta[lVar56 + 10],
                                           0xff < uVar70)) goto LAB_00172181;
                                        uVar60 = (uVar60 - (int)lVar64) - 9;
                                        psVar62 = (stbi__jpeg *)(ulong)uVar60;
                                        psVar47->code_bits = uVar60;
                                        psVar47->code_buffer =
                                             uVar40 << ((byte)(lVar56 + 10) & 0x1f);
                                        uVar76 = (ulong)uVar70;
                                      }
                                      else {
                                        bVar3 = psVar47->huff_ac[iVar39].size[uVar76];
                                        uVar60 = psVar47->code_bits - (uint)bVar3;
                                        psVar62 = (stbi__jpeg *)(ulong)uVar60;
                                        if (psVar47->code_bits < (int)(uint)bVar3)
                                        goto LAB_00172181;
                                        psVar47->code_buffer = uVar40 << (bVar3 & 0x1f);
                                        psVar47->code_bits = uVar60;
                                      }
                                      bVar3 = psVar47->huff_ac[iVar39].values[uVar76];
                                      uVar60 = bVar3 & 0xf;
                                      bVar28 = bVar3 >> 4;
                                      uVar40 = (uint)bVar28;
                                      iVar68 = (int)psVar62;
                                      if ((bVar3 & 0xf) == 0) {
                                        if (bVar3 < 0xf0) {
                                          iVar44 = 1 << bVar28;
                                          psVar47->eob_run = iVar44;
                                          if (0xf < bVar3) {
                                            if (iVar68 < (int)uVar40) {
                                              stbi__grow_buffer_unsafe(psVar47);
                                              iVar68 = psVar47->code_bits;
                                            }
                                            uVar60 = 0;
                                            if ((int)uVar40 <= iVar68) {
                                              uVar60 = psVar47->code_buffer << bVar28 |
                                                       psVar47->code_buffer >> 0x20 - bVar28;
                                              uVar70 = stbi__bmask[uVar40];
                                              psVar47->code_buffer = ~uVar70 & uVar60;
                                              uVar60 = uVar60 & uVar70;
                                              psVar47->code_bits = iVar68 - uVar40;
                                            }
                                            iVar44 = uVar60 + psVar47->eob_run;
                                          }
                                          goto LAB_0016f609;
                                        }
                                        uVar40 = iVar44 + 0x10;
                                      }
                                      else {
                                        lVar64 = (long)iVar44 + (ulong)uVar40;
                                        bVar3 = ""[lVar64];
                                        if (iVar68 < (int)uVar60) {
                                          stbi__grow_buffer_unsafe(psVar47);
                                          psVar62 = (stbi__jpeg *)(ulong)(uint)psVar47->code_bits;
                                        }
                                        iVar44 = 0;
                                        uVar40 = (int)psVar62 - uVar60;
                                        if ((int)uVar60 <= (int)psVar62) {
                                          uVar70 = psVar47->code_buffer;
                                          uVar73 = uVar70 << (sbyte)uVar60 |
                                                   uVar70 >> 0x20 - (sbyte)uVar60;
                                          uVar54 = *(uint *)((long)stbi__bmask + (ulong)(uVar60 * 4)
                                                            );
                                          psVar47->code_buffer = ~uVar54 & uVar73;
                                          psVar47->code_bits = uVar40;
                                          iVar44 = 0;
                                          if (-1 < (int)uVar70) {
                                            iVar44 = *(int *)((long)stbi__jbias +
                                                             (ulong)(uVar60 * 4));
                                          }
                                          iVar44 = (uVar73 & uVar54) + iVar44;
                                          psVar62 = (stbi__jpeg *)(ulong)uVar40;
                                        }
                                        uVar40 = (int)lVar64 + 1;
                                        psVar71[bVar3] = (short)(iVar44 << (bVar37 & 0x1f));
                                      }
                                    }
                                    else {
                                      uVar70 = uVar60 & 0xf;
                                      uVar54 = psVar47->code_bits - uVar70;
                                      psVar62 = (stbi__jpeg *)(ulong)uVar54;
                                      if (psVar47->code_bits < (int)uVar70) goto LAB_00172181;
                                      lVar64 = (long)iVar44 + (ulong)(uVar60 >> 4 & 0xf);
                                      psVar47->code_buffer = uVar40 << (sbyte)uVar70;
                                      psVar47->code_bits = uVar54;
                                      uVar40 = (int)lVar64 + 1;
                                      psVar71[""[lVar64]] =
                                           (short)((uVar60 >> 8) << (bVar37 & 0x1f));
                                    }
                                    uVar76 = (ulong)uVar40;
                                  } while ((int)uVar40 <= psVar47->spec_end);
                                }
                                else {
LAB_0016f609:
                                  psVar47->eob_run = iVar44 + -1;
                                }
                              }
                              else if (iVar44 == 0) {
                                iVar44 = 0x10000 << (bVar37 & 0x1f);
                                uVar40 = iVar44 >> 0x10;
                                psVar62 = (stbi__jpeg *)(ulong)(uint)psVar47->code_bits;
                                do {
                                  if ((int)psVar62 < 0x10) {
                                    stbi__grow_buffer_unsafe(psVar47);
                                  }
                                  uVar70 = psVar47->code_buffer;
                                  uVar72 = (ulong)psVar47->huff_ac[iVar39].fast[uVar70 >> 0x17];
                                  if (uVar72 == 0xff) {
                                    lVar64 = 0;
                                    do {
                                      lVar56 = lVar64;
                                      lVar64 = lVar56 + 1;
                                    } while (psVar47->huff_ac[iVar39].maxcode[lVar56 + 10] <=
                                             uVar70 >> 0x10);
                                    uVar60 = psVar47->code_bits;
                                    psVar62 = (stbi__jpeg *)(ulong)uVar60;
                                    if (lVar64 == 8) goto LAB_00172177;
                                    if (((int)uVar60 < (int)(lVar56 + 10)) ||
                                       (uVar54 = (uVar70 >> (0x17U - (char)lVar64 & 0x1f) &
                                                 stbi__bmask[lVar56 + 10]) +
                                                 psVar47->huff_ac[iVar39].delta[lVar56 + 10],
                                       0xff < uVar54)) goto LAB_00172181;
                                    sVar42 = uVar70 << ((byte)(lVar56 + 10) & 0x1f);
                                    uVar60 = (uVar60 - (int)lVar64) - 9;
                                    psVar62 = (stbi__jpeg *)(ulong)uVar60;
                                    psVar47->code_bits = uVar60;
                                    psVar47->code_buffer = sVar42;
                                    uVar72 = (ulong)uVar54;
                                  }
                                  else {
                                    bVar37 = psVar47->huff_ac[iVar39].size[uVar72];
                                    uVar60 = psVar47->code_bits - (uint)bVar37;
                                    psVar62 = (stbi__jpeg *)(ulong)uVar60;
                                    if (psVar47->code_bits < (int)(uint)bVar37) goto LAB_00172181;
                                    sVar42 = uVar70 << (bVar37 & 0x1f);
                                    psVar47->code_buffer = sVar42;
                                    psVar47->code_bits = uVar60;
                                  }
                                  bVar37 = psVar47->huff_ac[iVar39].values[uVar72];
                                  bVar3 = bVar37 >> 4;
                                  uVar70 = (uint)bVar3;
                                  uVar60 = (uint)psVar62;
                                  if ((bVar37 & 0xf) == 1) {
                                    uVar54 = uVar70;
                                    uVar73 = -uVar40;
                                    if ((int)uVar60 < 1) {
                                      stbi__grow_buffer_unsafe(psVar47);
                                      uVar60 = psVar47->code_bits;
                                      psVar62 = (stbi__jpeg *)(ulong)uVar60;
                                      if ((int)uVar60 < 1) goto LAB_0016f8cc;
                                      sVar42 = psVar47->code_buffer;
                                    }
                                    psVar47->code_buffer = sVar42 * 2;
                                    psVar62 = (stbi__jpeg *)(ulong)(uVar60 - 1);
                                    psVar47->code_bits = uVar60 - 1;
                                    if ((int)sVar42 < 0) {
                                      uVar73 = uVar40;
                                    }
                                  }
                                  else {
                                    if ((bVar37 & 0xf) != 0) goto LAB_00172181;
                                    uVar54 = 0xf;
                                    uVar73 = 0;
                                    if (bVar37 < 0xf0) {
                                      psVar47->eob_run = ~(-1 << bVar3);
                                      uVar54 = 0x40;
                                      if (0xf < bVar37) {
                                        if ((int)uVar60 < (int)uVar70) {
                                          stbi__grow_buffer_unsafe(psVar47);
                                          psVar62 = (stbi__jpeg *)(ulong)(uint)psVar47->code_bits;
                                        }
                                        uVar73 = 0;
                                        uVar60 = (int)psVar62 - uVar70;
                                        if ((int)uVar70 <= (int)psVar62) {
                                          uVar73 = psVar47->code_buffer << bVar3 |
                                                   psVar47->code_buffer >> 0x20 - bVar3;
                                          uVar70 = stbi__bmask[uVar70];
                                          psVar47->code_buffer = ~uVar70 & uVar73;
                                          uVar73 = uVar73 & uVar70;
                                          psVar47->code_bits = uVar60;
                                          psVar62 = (stbi__jpeg *)(ulong)uVar60;
                                        }
                                        psVar47->eob_run = psVar47->eob_run + uVar73;
                                        uVar73 = 0;
                                      }
                                    }
                                  }
LAB_0016f8cc:
                                  uVar60 = psVar47->spec_end;
                                  uVar72 = (ulong)uVar60;
                                  if ((int)uVar76 <= (int)uVar60) {
                                    uVar67 = (long)(int)uVar76;
                                    local_484 = uVar73;
                                    do {
                                      uVar60 = (uint)uVar72;
                                      uVar70 = (uint)psVar62;
                                      bVar37 = ""[uVar67];
                                      if (psVar71[bVar37] == 0) {
                                        if (uVar54 == 0) {
                                          uVar76 = (ulong)((int)uVar67 + 1);
                                          psVar71[bVar37] = (short)local_484;
                                          break;
                                        }
                                        uVar54 = uVar54 - 1;
                                      }
                                      else {
                                        if ((int)uVar70 < 1) {
                                          stbi__grow_buffer_unsafe(psVar47);
                                          uVar70 = psVar47->code_bits;
                                          psVar62 = (stbi__jpeg *)(ulong)uVar70;
                                          if ((int)uVar70 < 1) goto LAB_0016f952;
                                        }
                                        sVar42 = psVar47->code_buffer;
                                        psVar47->code_buffer = sVar42 * 2;
                                        psVar62 = (stbi__jpeg *)(ulong)(uVar70 - 1);
                                        psVar47->code_bits = uVar70 - 1;
                                        if (((int)sVar42 < 0) &&
                                           (sVar5 = psVar71[bVar37], (uVar40 & (int)sVar5) == 0)) {
                                          sVar29 = (short)((uint)iVar44 >> 0x10);
                                          if (sVar5 < 1) {
                                            sVar29 = -sVar29;
                                          }
                                          psVar71[bVar37] = sVar5 + sVar29;
                                        }
                                      }
LAB_0016f952:
                                      uVar76 = uVar67 + 1;
                                      uVar60 = psVar47->spec_end;
                                      uVar72 = (ulong)(int)uVar60;
                                      bVar77 = (long)uVar67 < (long)uVar72;
                                      uVar67 = uVar76;
                                    } while (bVar77);
                                  }
                                } while ((int)uVar76 <= (int)uVar60);
                              }
                              else {
                                psVar47->eob_run = iVar44 + -1;
                                if (psVar47->spec_start <= psVar47->spec_end) {
                                  uVar40 = (0x10000 << (bVar37 & 0x1f)) >> 0x10;
                                  do {
                                    bVar37 = ""[uVar76];
                                    if (psVar71[bVar37] != 0) {
                                      iVar39 = psVar47->code_bits;
                                      if (iVar39 < 1) {
                                        stbi__grow_buffer_unsafe(psVar47);
                                        iVar39 = psVar47->code_bits;
                                        if (iVar39 < 1) goto LAB_0016f5b5;
                                      }
                                      sVar42 = psVar47->code_buffer;
                                      psVar47->code_buffer = sVar42 * 2;
                                      psVar47->code_bits = iVar39 + -1;
                                      if (((int)sVar42 < 0) &&
                                         (sVar5 = psVar71[bVar37], (uVar40 & (int)sVar5) == 0)) {
                                        uVar60 = -uVar40;
                                        if (0 < sVar5) {
                                          uVar60 = uVar40;
                                        }
                                        psVar71[bVar37] = (short)uVar60 + sVar5;
                                      }
                                    }
LAB_0016f5b5:
                                    bVar77 = (long)uVar76 < (long)psVar47->spec_end;
                                    uVar76 = uVar76 + 1;
                                  } while (bVar77);
                                }
                              }
                            }
                            iVar39 = psVar47->todo;
                            psVar47->todo = iVar39 + -1;
                            if (iVar39 < 2) {
                              if (psVar47->code_bits < 0x18) {
                                stbi__grow_buffer_unsafe(psVar47);
                              }
                              bVar37 = psVar47->marker;
                              if ((bVar37 & 0xf8) != 0xd0) goto LAB_00170270;
                              psVar47->code_buffer = 0;
                              psVar47->code_bits = 0;
                              psVar47->nomore = 0;
                              psVar47->img_comp[3].dc_pred = 0;
                              psVar47->img_comp[2].dc_pred = 0;
                              psVar47->img_comp[1].dc_pred = 0;
                              psVar47->img_comp[0].dc_pred = 0;
                              psVar47->marker = 0xff;
                              iVar39 = psVar47->restart_interval;
                              if (iVar39 == 0) {
                                iVar39 = 0x7fffffff;
                              }
                              psVar47->todo = iVar39;
                              psVar47->eob_run = 0;
                            }
                            iVar41 = iVar41 + 1;
                          } while (iVar41 != (int)local_470);
                        }
                        local_4e4 = local_4e4 + 1;
                      } while (local_4e4 != local_488);
                    }
                  }
                  else {
                    iVar41 = psVar47->img_mcu_y;
                    if (0 < iVar41) {
                      iVar44 = psVar47->img_mcu_x;
                      iVar68 = 0;
                      do {
                        if (0 < iVar44) {
                          iVar41 = 0;
                          do {
                            iVar44 = psVar47->scan_n;
                            if (0 < iVar44) {
                              lVar64 = 0;
                              do {
                                iVar39 = psVar47->order[lVar64];
                                iVar45 = psVar47->img_comp[iVar39].v;
                                if (0 < iVar45) {
                                  iVar44 = paVar1[iVar39].h;
                                  iVar113 = 0;
                                  do {
                                    if (0 < iVar44) {
                                      iVar45 = 0;
                                      do {
                                        iVar44 = stbi__jpeg_decode_block_prog_dc
                                                           (psVar47,paVar1[iVar39].coeff +
                                                                    (iVar44 * iVar41 + iVar45 +
                                                                    (paVar1[iVar39].v * iVar68 +
                                                                    iVar113) *
                                                                    paVar1[iVar39].coeff_w) * 0x40,
                                                            (stbi__huffman *)
                                                            psVar47->huff_dc[paVar1[iVar39].hd].fast
                                                            ,iVar39);
                                        psVar62 = extraout_RDX_09;
                                        if (iVar44 == 0) goto LAB_00171265;
                                        iVar45 = iVar45 + 1;
                                        iVar44 = paVar1[iVar39].h;
                                      } while (iVar45 < iVar44);
                                      iVar45 = paVar1[iVar39].v;
                                    }
                                    iVar113 = iVar113 + 1;
                                  } while (iVar113 < iVar45);
                                  iVar44 = psVar47->scan_n;
                                }
                                lVar64 = lVar64 + 1;
                              } while (lVar64 < iVar44);
                              iVar39 = psVar47->todo;
                            }
                            psVar47->todo = iVar39 + -1;
                            bVar77 = iVar39 < 2;
                            iVar39 = iVar39 + -1;
                            if (bVar77) {
                              if (psVar47->code_bits < 0x18) {
                                stbi__grow_buffer_unsafe(psVar47);
                              }
                              bVar37 = psVar47->marker;
                              if ((bVar37 & 0xf8) != 0xd0) goto LAB_00170270;
                              psVar47->code_buffer = 0;
                              psVar47->code_bits = 0;
                              psVar47->nomore = 0;
                              psVar47->img_comp[3].dc_pred = 0;
                              psVar47->img_comp[2].dc_pred = 0;
                              psVar47->img_comp[1].dc_pred = 0;
                              psVar47->img_comp[0].dc_pred = 0;
                              psVar47->marker = 0xff;
                              iVar39 = psVar47->restart_interval;
                              if (iVar39 == 0) {
                                iVar39 = 0x7fffffff;
                              }
                              psVar47->todo = iVar39;
                              psVar47->eob_run = 0;
                            }
                            iVar41 = iVar41 + 1;
                            iVar44 = psVar47->img_mcu_x;
                          } while (iVar41 < iVar44);
                          iVar41 = psVar47->img_mcu_y;
                        }
                        iVar68 = iVar68 + 1;
                      } while (iVar68 < iVar41);
                    }
                  }
                  goto LAB_00170269;
                }
                stbi__g_failure_reason = "bad SOS len";
              }
              else {
                if (psVar49->read_from_callbacks != 0) {
                  stbi__refill_buffer(psVar49);
                  pbVar66 = psVar49->img_buffer;
                  psVar62 = extraout_RDX_04;
                  goto LAB_0016f11e;
                }
                psVar47->scan_n = 0;
LAB_00171257:
                stbi__g_failure_reason = "bad SOS component count";
              }
              goto LAB_00171265;
            }
            uVar40 = (uint)bVar37;
            if (uVar40 == 0xdc) {
              iVar41 = stbi__get16be(psVar47->s);
              sVar42 = stbi__get16be(psVar47->s);
              psVar62 = extraout_RDX_01;
              if (iVar41 != 4) {
                stbi__g_failure_reason = "bad DNL len";
                goto LAB_00171265;
              }
              if (sVar42 != psVar47->s->img_y) {
                stbi__g_failure_reason = "bad DNL height";
                goto LAB_00171265;
              }
LAB_0016f0c9:
              bVar37 = stbi__get_marker(psVar47);
              uVar61 = extraout_RDX_02;
              goto LAB_0016f06b;
            }
            if (uVar40 == 0xd9) {
              psVar49 = psVar47->s;
              if ((psVar47->progressive != 0) && (0 < psVar49->img_n)) {
                lVar64 = 0;
                do {
                  iVar41 = psVar47->img_comp[lVar64].y + 7 >> 3;
                  if (0 < iVar41) {
                    uVar40 = paVar1[lVar64].x + 7 >> 3;
                    iVar39 = 0;
                    do {
                      if (0 < (int)uVar40) {
                        uVar76 = 0;
                        do {
                          psVar71 = paVar1[lVar64].coeff +
                                    (paVar1[lVar64].coeff_w * iVar39 + (int)uVar76) * 0x40;
                          iVar44 = paVar1[lVar64].tq;
                          lVar56 = 0;
                          do {
                            psVar71[lVar56] = psVar71[lVar56] * psVar47->dequant[iVar44][lVar56];
                            lVar56 = lVar56 + 1;
                          } while (lVar56 != 0x40);
                          (*psVar47->idct_block_kernel)
                                    (paVar1[lVar64].data +
                                     uVar76 * 8 + (long)(iVar39 * 8 * paVar1[lVar64].w2),
                                     paVar1[lVar64].w2,psVar71);
                          uVar76 = uVar76 + 1;
                          uVar61 = extraout_RDX_13;
                        } while (uVar76 != uVar40);
                      }
                      iVar39 = iVar39 + 1;
                    } while (iVar39 != iVar41);
                    psVar49 = psVar47->s;
                  }
                  iVar41 = (int)uVar61;
                  lVar64 = lVar64 + 1;
                } while (lVar64 < psVar49->img_n);
              }
            }
            else {
              iVar41 = stbi__process_marker(psVar47,uVar40);
              if (iVar41 != 0) goto LAB_0016f0c9;
              psVar49 = psVar47->s;
              iVar41 = extraout_EDX;
            }
            uVar40 = psVar49->img_n;
            uVar60 = (2 < (int)uVar40) + 1 + (uint)(2 < (int)uVar40);
            if (req_comp != 0) {
              uVar60 = req_comp;
            }
            if (uVar40 == 3) {
              bVar77 = true;
              if (psVar47->rgb != 3) {
                if (psVar47->app14_color_transform != 0) goto LAB_001707d0;
                bVar77 = psVar47->jfif == 0;
              }
            }
            else {
LAB_001707d0:
              bVar77 = false;
            }
            uVar70 = 1;
            if (bVar77) {
              uVar70 = uVar40;
            }
            if (2 < (int)uVar60) {
              uVar70 = uVar40;
            }
            if (uVar40 != 3) {
              uVar70 = uVar40;
            }
            if (0 < (int)uVar70) {
              local_4a8 = (undefined1  [16])0x0;
              _local_4b8 = (undefined1  [16])0x0;
              sVar42 = psVar49->img_x;
              lVar64 = 0;
              do {
                pvVar46 = malloc((ulong)(sVar42 + 3));
                *(void **)((long)&psVar47->img_comp[0].linebuf + lVar64 * 2) = pvVar46;
                if (pvVar46 == (void *)0x0) {
                  stbi__free_jpeg_components(psVar47,uVar40,why);
                  goto LAB_001713f6;
                }
                uVar76 = (long)psVar47->img_h_max /
                         (long)*(int *)((long)&psVar47->img_comp[0].h + lVar64 * 2);
                iVar41 = (int)uVar76;
                *(int *)((long)aiStack_410 + lVar64 + -0x10) = iVar41;
                iVar39 = psVar47->img_v_max / *(int *)((long)&psVar47->img_comp[0].v + lVar64 * 2);
                *(int *)((long)aiStack_410 + lVar64 + -0xc) = iVar39;
                *(int *)((long)aiStack_410 + lVar64 + -4) = iVar39 >> 1;
                *(int *)((long)aiStack_410 + lVar64 + -8) =
                     (int)((ulong)(iVar41 + (sVar42 - 1)) / (uVar76 & 0xffffffff));
                *(undefined4 *)((long)aiStack_410 + lVar64) = 0;
                uVar61 = *(undefined8 *)((long)&psVar47->img_comp[0].data + lVar64 * 2);
                *(undefined8 *)((long)aiStack_410 + lVar64 + -0x18) = uVar61;
                *(undefined8 *)((long)aiStack_410 + lVar64 + -0x20) = uVar61;
                if (iVar41 == 2) {
                  pcVar51 = stbi__resample_row_h_2;
                  if (iVar39 != 1) {
                    if (iVar39 != 2) goto LAB_00170902;
                    pcVar51 = psVar47->resample_row_hv_2_kernel;
                  }
                }
                else if (iVar41 == 1) {
                  pcVar51 = stbi__resample_row_generic;
                  if (iVar39 == 2) {
                    pcVar51 = stbi__resample_row_v_2;
                  }
                  if (iVar39 == 1) {
                    pcVar51 = resample_row_1;
                  }
                }
                else {
LAB_00170902:
                  pcVar51 = stbi__resample_row_generic;
                }
                *(code **)((long)&local_438.s + lVar64) = pcVar51;
                lVar64 = lVar64 + 0x30;
              } while ((ulong)uVar70 * 0x30 != lVar64);
              sVar6 = psVar49->img_y;
              psVar48 = (stbi__uint16 *)stbi__malloc_mad3(uVar60,sVar42,sVar6,1);
              if (psVar48 != (stbi__uint16 *)0x0) {
                iVar41 = why_00;
                if (sVar6 != 0) {
                  iVar39 = 0;
                  uVar40 = 0;
                  do {
                    sVar42 = psVar49->img_x;
                    puVar65 = (undefined8 *)local_4b8;
                    lVar64 = 0;
                    do {
                      puVar52 = (undefined8 *)((long)aiStack_410 + lVar64 + -0x18);
                      iVar41 = *(int *)((long)aiStack_410 + lVar64 + -4);
                      iVar44 = *(int *)((long)aiStack_410 + lVar64 + -0xc);
                      iVar68 = iVar44 >> 1;
                      puVar2 = (undefined8 *)((long)aiStack_410 + lVar64 + -0x20);
                      puVar57 = puVar52;
                      if (iVar41 < iVar68) {
                        puVar57 = puVar2;
                      }
                      if (iVar68 <= iVar41) {
                        puVar52 = puVar2;
                      }
                      auVar118 = (**(code **)((long)&local_438.s + lVar64))
                                           (*(undefined8 *)
                                             ((long)&psVar47->img_comp[0].linebuf + lVar64 * 2),
                                            *puVar57,*puVar52,
                                            *(undefined4 *)((long)aiStack_410 + lVar64 + -8),
                                            *(undefined4 *)((long)aiStack_410 + lVar64 + -0x10));
                      uVar76 = auVar118._8_8_;
                      *puVar65 = auVar118._0_8_;
                      *(int *)((long)aiStack_410 + lVar64 + -4) = iVar41 + 1;
                      if (iVar44 <= iVar41 + 1) {
                        *(undefined4 *)((long)aiStack_410 + lVar64 + -4) = 0;
                        lVar56 = *(long *)((long)aiStack_410 + lVar64 + -0x18);
                        *(long *)((long)aiStack_410 + lVar64 + -0x20) = lVar56;
                        iVar41 = *(int *)((long)aiStack_410 + lVar64) + 1;
                        *(int *)((long)aiStack_410 + lVar64) = iVar41;
                        if (iVar41 < *(int *)((long)&psVar47->img_comp[0].y + lVar64 * 2)) {
                          *(long *)((long)aiStack_410 + lVar64 + -0x18) =
                               lVar56 + *(int *)((long)&psVar47->img_comp[0].w2 + lVar64 * 2);
                        }
                      }
                      lVar64 = lVar64 + 0x30;
                      puVar65 = puVar65 + 1;
                    } while ((ulong)uVar70 * 0x30 != lVar64);
                    if ((int)uVar60 < 3) {
                      psVar49 = psVar47->s;
                      if (!bVar77) {
                        if (psVar49->img_n == 4) {
                          if (psVar47->app14_color_transform == 2) {
                            if (psVar49->img_x != 0) {
                              puVar50 = (uchar *)((long)psVar48 + (ulong)(sVar42 * iVar39) + 1);
                              uVar76 = 0;
                              do {
                                iVar41 = (*(byte *)(local_4b8._0_8_ + uVar76) ^ 0xff) *
                                         (uint)*(byte *)(local_4a8._8_8_ + uVar76);
                                puVar50[-1] = (uchar)((iVar41 + 0x80U >> 8) + iVar41 + 0x80 >> 8);
                                *puVar50 = 0xff;
                                uVar76 = uVar76 + 1;
                                puVar50 = puVar50 + uVar60;
                              } while (uVar76 < psVar49->img_x);
                            }
                          }
                          else {
                            if (psVar47->app14_color_transform != 0) goto LAB_00170d92;
                            if (psVar49->img_x != 0) {
                              puVar50 = (uchar *)((long)psVar48 + (ulong)(sVar42 * iVar39) + 1);
                              uVar76 = 0;
                              do {
                                bVar37 = *(byte *)(local_4a8._8_8_ + uVar76);
                                iVar41 = (uint)*(byte *)(local_4b8._0_8_ + uVar76) * (uint)bVar37;
                                iVar44 = (uint)stack0xfffffffffffffb50[uVar76] * (uint)bVar37;
                                puVar50[-1] = (uchar)((((uint)*(byte *)(local_4a8._0_8_ + uVar76) *
                                                        (uint)bVar37 + 0x80 >> 8) +
                                                       (uint)*(byte *)(local_4a8._0_8_ + uVar76) *
                                                       (uint)bVar37 + 0x80 >> 8) * 0x1d +
                                                      (iVar44 + (iVar44 + 0x80U >> 8) + 0x80 >> 8) *
                                                      0x96 + (iVar41 + (iVar41 + 0x80U >> 8) + 0x80
                                                             >> 8) * 0x4d >> 8);
                                *puVar50 = 0xff;
                                uVar76 = uVar76 + 1;
                                puVar50 = puVar50 + uVar60;
                                psVar75 = stack0xfffffffffffffb50;
                              } while (uVar76 < psVar49->img_x);
                              goto LAB_00170fa3;
                            }
                          }
                        }
                        else {
LAB_00170d92:
                          if (uVar60 == 1) {
                            if (psVar49->img_x != 0) {
                              uVar72 = 0;
                              do {
                                *(uchar *)((long)psVar48 + uVar72 + sVar42 * iVar39) =
                                     *(uchar *)(local_4b8._0_8_ + uVar72);
                                uVar72 = uVar72 + 1;
                                uVar76 = (ulong)psVar49->img_x;
                              } while (uVar72 < uVar76);
                            }
                          }
                          else if (psVar49->img_x != 0) {
                            uVar72 = 0;
                            do {
                              *(uchar *)((long)psVar48 + uVar72 * 2 + (ulong)(sVar42 * iVar39)) =
                                   *(uchar *)(local_4b8._0_8_ + uVar72);
                              *(uchar *)((long)psVar48 + uVar72 * 2 + (ulong)(sVar42 * iVar39) + 1)
                                   = 0xff;
                              uVar72 = uVar72 + 1;
                              uVar76 = (ulong)psVar49->img_x;
                            } while (uVar72 < uVar76);
                          }
                        }
                        goto LAB_00171013;
                      }
                      if (uVar60 != 1) {
                        if (psVar49->img_x != 0) {
                          uVar76 = 0;
                          do {
                            bVar37 = *(byte *)(local_4a8._0_8_ + uVar76);
                            *(uchar *)((long)psVar48 + uVar76 * 2 + (ulong)(sVar42 * iVar39)) =
                                 (uchar)((uint)bVar37 * 2 + ((uint)bVar37 + (uint)bVar37 * 8) * 3 +
                                         (uint)stack0xfffffffffffffb50[uVar76] * 0x96 +
                                         (uint)*(byte *)(local_4b8._0_8_ + uVar76) * 0x4d >> 8);
                            *(uchar *)((long)psVar48 + uVar76 * 2 + (ulong)(sVar42 * iVar39) + 1) =
                                 0xff;
                            uVar76 = uVar76 + 1;
                          } while (uVar76 < psVar49->img_x);
                          goto LAB_00170ea5;
                        }
                        goto LAB_00171013;
                      }
                      if (psVar49->img_x == 0) goto LAB_00171013;
                      uVar76 = 0;
                      do {
                        bVar37 = *(byte *)(local_4a8._0_8_ + uVar76);
                        *(uchar *)((long)psVar48 + uVar76 + sVar42 * iVar39) =
                             (uchar)((uint)bVar37 * 2 + ((uint)bVar37 + (uint)bVar37 * 8) * 3 +
                                     (uint)stack0xfffffffffffffb50[uVar76] * 0x96 +
                                     (uint)*(byte *)(local_4b8._0_8_ + uVar76) * 0x4d >> 8);
                        uVar76 = uVar76 + 1;
                      } while (uVar76 < psVar49->img_x);
LAB_00170ea5:
                      iVar41 = local_4a8._0_4_;
                    }
                    else {
                      psVar75 = (stbi_uc *)((ulong)(uVar40 * uVar60 * sVar42) + (long)psVar48);
                      psVar49 = psVar47->s;
                      if (psVar49->img_n == 3) {
                        if (bVar77) {
                          if (psVar49->img_x != 0) {
                            puVar50 = (uchar *)((long)psVar48 + (ulong)(sVar42 * iVar39) + 3);
                            uVar76 = 0;
                            do {
                              puVar50[-3] = *(uchar *)(local_4b8._0_8_ + uVar76);
                              puVar50[-2] = stack0xfffffffffffffb50[uVar76];
                              puVar50[-1] = *(uchar *)(local_4a8._0_8_ + uVar76);
                              *puVar50 = 0xff;
                              uVar76 = uVar76 + 1;
                              puVar50 = puVar50 + uVar60;
                            } while (uVar76 < psVar49->img_x);
                          }
                        }
                        else {
LAB_00170e05:
                          (*psVar47->YCbCr_to_RGB_kernel)
                                    (psVar75,(stbi_uc *)local_4b8._0_8_,stack0xfffffffffffffb50,
                                     (stbi_uc *)local_4a8._0_8_,psVar49->img_x,uVar60);
                          psVar49 = psVar47->s;
                          uVar76 = extraout_RDX_14;
                        }
                      }
                      else if (psVar49->img_n == 4) {
                        if (psVar47->app14_color_transform == 2) {
                          (*psVar47->YCbCr_to_RGB_kernel)
                                    (psVar75,(stbi_uc *)local_4b8._0_8_,stack0xfffffffffffffb50,
                                     (stbi_uc *)local_4a8._0_8_,psVar49->img_x,uVar60);
                          psVar49 = psVar47->s;
                          uVar76 = extraout_RDX_15;
                          if (psVar49->img_x != 0) {
                            pbVar66 = (byte *)((long)psVar48 + (ulong)(sVar42 * iVar39) + 2);
                            psVar58 = (stbi_uc *)0x0;
                            do {
                              bVar37 = psVar58[local_4a8._8_8_];
                              iVar41 = (pbVar66[-2] ^ 0xff) * (uint)bVar37;
                              pbVar66[-2] = (byte)((iVar41 + 0x80U >> 8) + iVar41 + 0x80 >> 8);
                              iVar41 = (pbVar66[-1] ^ 0xff) * (uint)bVar37;
                              pbVar66[-1] = (byte)((iVar41 + 0x80U >> 8) + iVar41 + 0x80 >> 8);
                              iVar41 = (*pbVar66 ^ 0xff) * (uint)bVar37;
                              *pbVar66 = (byte)((iVar41 + 0x80U >> 8) + iVar41 + 0x80 >> 8);
                              psVar58 = psVar58 + 1;
                              pbVar66 = pbVar66 + uVar60;
                              psVar75 = (stbi_uc *)(ulong)psVar49->img_x;
                            } while (psVar58 < (stbi_uc *)(ulong)psVar49->img_x);
LAB_00170fa3:
                            iVar41 = (int)psVar75;
                            goto LAB_00171017;
                          }
                        }
                        else {
                          if (psVar47->app14_color_transform != 0) goto LAB_00170e05;
                          if (psVar49->img_x != 0) {
                            puVar50 = (uchar *)((long)psVar48 + (ulong)(sVar42 * iVar39) + 3);
                            uVar76 = 0;
                            do {
                              bVar37 = *(byte *)(local_4a8._8_8_ + uVar76);
                              iVar41 = (uint)*(byte *)(local_4b8._0_8_ + uVar76) * (uint)bVar37;
                              puVar50[-3] = (uchar)((iVar41 + 0x80U >> 8) + iVar41 + 0x80 >> 8);
                              iVar41 = (uint)stack0xfffffffffffffb50[uVar76] * (uint)bVar37;
                              puVar50[-2] = (uchar)((iVar41 + 0x80U >> 8) + iVar41 + 0x80 >> 8);
                              puVar50[-1] = (uchar)(((uint)*(byte *)(local_4a8._0_8_ + uVar76) *
                                                     (uint)bVar37 + 0x80 >> 8) +
                                                    (uint)*(byte *)(local_4a8._0_8_ + uVar76) *
                                                    (uint)bVar37 + 0x80 >> 8);
                              *puVar50 = 0xff;
                              uVar76 = uVar76 + 1;
                              puVar50 = puVar50 + uVar60;
                            } while (uVar76 < psVar49->img_x);
                            goto LAB_00170ea5;
                          }
                        }
                      }
                      else if (psVar49->img_x != 0) {
                        puVar50 = (uchar *)((long)psVar48 + (ulong)(sVar42 * iVar39) + 3);
                        uVar72 = 0;
                        do {
                          uVar4 = *(uchar *)(local_4b8._0_8_ + uVar72);
                          puVar50[-1] = uVar4;
                          puVar50[-2] = uVar4;
                          puVar50[-3] = uVar4;
                          *puVar50 = 0xff;
                          uVar72 = uVar72 + 1;
                          puVar50 = puVar50 + uVar60;
                        } while (uVar72 < psVar49->img_x);
                      }
LAB_00171013:
                      iVar41 = (int)uVar76;
                    }
LAB_00171017:
                    uVar40 = uVar40 + 1;
                    iVar39 = iVar39 + uVar60;
                  } while (uVar40 < psVar49->img_y);
                  uVar40 = psVar49->img_n;
                }
                stbi__free_jpeg_components(psVar47,uVar40,iVar41);
                psVar49 = psVar47->s;
                *local_460 = psVar49->img_x;
                *y = psVar49->img_y;
                if (comp != (int *)0x0) {
                  *comp = (uint)(2 < psVar49->img_n) * 2 + 1;
                }
                goto LAB_0017127b;
              }
              stbi__free_jpeg_components(psVar47,uVar40,why_00);
LAB_001713f6:
              stbi__g_failure_reason = "outofmem";
              goto LAB_00171278;
            }
          }
          stbi__free_jpeg_components(psVar47,uVar40,iVar41);
        }
        else {
          stbi__g_failure_reason = "bad req_comp";
        }
LAB_00171278:
        psVar48 = (stbi__uint16 *)0x0;
LAB_0017127b:
        free(psVar47);
        return psVar48;
      }
      stbi__g_failure_reason = "no SOI";
      psVar58 = s->img_buffer_original;
      psVar75 = s->img_buffer_original_end;
      s->img_buffer = psVar58;
      s->img_buffer_end = psVar75;
      free(psVar47);
    }
    if (psVar58 < psVar75) {
LAB_0016ee33:
      s->img_buffer = psVar58 + 1;
      bVar77 = *psVar58 != 'P';
      psVar58 = psVar58 + 1;
    }
    else {
      if (s->read_from_callbacks != 0) {
        stbi__refill_buffer(s);
        psVar58 = s->img_buffer;
        psVar75 = s->img_buffer_end;
        goto LAB_0016ee33;
      }
      bVar77 = true;
    }
    if (psVar58 < psVar75) {
LAB_0016ee66:
      s->img_buffer = psVar58 + 1;
      if (!(bool)(bVar77 | (byte)(*psVar58 - 0x37) < 0xfe)) {
        y_00 = &s->img_y;
        comp_00 = &s->img_n;
        iVar39 = stbi__pnm_info(s,(int *)s,(int *)y_00,comp_00);
        ri->bits_per_channel = iVar39;
        if (iVar39 == 0) {
          return (void *)0x0;
        }
        if ((*y_00 < 0x1000001) && (s->img_x < 0x1000001)) {
          *local_460 = s->img_x;
          sVar42 = *y_00;
          *y = sVar42;
          iVar39 = *comp_00;
          if (comp != (int *)0x0) {
            *comp = iVar39;
            sVar42 = *y_00;
          }
          sVar6 = s->img_x;
          iVar44 = ri->bits_per_channel;
          iVar68 = iVar44 + 7;
          if (-1 < iVar44) {
            iVar68 = iVar44;
          }
          iVar68 = iVar68 >> 3;
          iVar44 = stbi__mad4sizes_valid(iVar39,sVar6,sVar42,iVar68,iVar41);
          if (iVar44 != 0) {
            psVar48 = (stbi__uint16 *)stbi__malloc_mad4(iVar39,sVar6,sVar42,iVar68,iVar41);
            if (psVar48 != (stbi__uint16 *)0x0) {
              iVar41 = stbi__getn(s,(stbi_uc *)psVar48,sVar42 * iVar39 * sVar6 * iVar68);
              if (iVar41 == 0) {
                free(psVar48);
                stbi__g_failure_reason = "bad PNM";
                return (void *)0x0;
              }
              if (req_comp == 0) {
                return psVar48;
              }
              iVar41 = *comp_00;
              if (iVar41 == req_comp) {
                return psVar48;
              }
              if (ri->bits_per_channel != 0x10) {
                puVar50 = stbi__convert_format((uchar *)psVar48,iVar41,req_comp,s->img_x,s->img_y);
                return puVar50;
              }
              psVar48 = stbi__convert_format16(psVar48,iVar41,req_comp,s->img_x,s->img_y);
              return psVar48;
            }
LAB_00170528:
            stbi__g_failure_reason = "outofmem";
            return (void *)0x0;
          }
        }
        goto LAB_0017051f;
      }
    }
    else if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar58 = s->img_buffer;
      goto LAB_0016ee66;
    }
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    stbi__g_failure_reason = "unknown image type";
  }
  return (void *)0x0;
LAB_0017024f:
  bVar77 = false;
LAB_00170261:
  if (!bVar77) goto LAB_00171265;
LAB_00170269:
  bVar37 = psVar47->marker;
LAB_00170270:
  if (bVar37 == 0xff) {
    while (psVar49 = psVar47->s, (psVar49->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00170385:
      if (psVar49->img_buffer_end <= psVar49->img_buffer) goto LAB_00170399;
LAB_0017028b:
      psVar49 = psVar47->s;
      psVar75 = psVar49->img_buffer;
      if (psVar75 < psVar49->img_buffer_end) {
LAB_001702bc:
        psVar49->img_buffer = psVar75 + 1;
        sVar36 = *psVar75;
      }
      else {
        if (psVar49->read_from_callbacks != 0) {
          stbi__refill_buffer(psVar49);
          psVar75 = psVar49->img_buffer;
          goto LAB_001702bc;
        }
        sVar36 = '\0';
      }
      while (sVar36 == 0xff) {
        psVar49 = psVar47->s;
        if ((psVar49->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001702f5:
          if (psVar49->img_buffer_end <= psVar49->img_buffer) goto LAB_00170399;
        }
        else {
          iVar41 = (*(psVar49->io).eof)(psVar49->io_user_data);
          if (iVar41 != 0) {
            if (psVar49->read_from_callbacks != 0) goto LAB_001702f5;
            goto LAB_00170399;
          }
        }
        psVar49 = psVar47->s;
        psVar75 = psVar49->img_buffer;
        if (psVar75 < psVar49->img_buffer_end) {
LAB_00170336:
          psVar49->img_buffer = psVar75 + 1;
          sVar36 = *psVar75;
        }
        else {
          if (psVar49->read_from_callbacks != 0) {
            stbi__refill_buffer(psVar49);
            psVar75 = psVar49->img_buffer;
            goto LAB_00170336;
          }
          sVar36 = '\0';
        }
        if ((byte)(sVar36 - 1) < 0xfe) goto LAB_0017039b;
      }
    }
    iVar41 = (*(psVar49->io).eof)(psVar49->io_user_data);
    if (iVar41 == 0) goto LAB_0017028b;
    if (psVar49->read_from_callbacks != 0) goto LAB_00170385;
LAB_00170399:
    sVar36 = 0xff;
LAB_0017039b:
    psVar47->marker = sVar36;
  }
  bVar37 = stbi__get_marker(psVar47);
  uVar61 = extraout_RDX_12;
  if ((bVar37 & 0xf8) != 0xd0) goto LAB_0016f06b;
  goto LAB_0016f0c9;
LAB_00172177:
  psVar62 = (stbi__jpeg *)(ulong)(uVar60 - 0x10);
  psVar47->code_bits = uVar60 - 0x10;
LAB_00172181:
  stbi__g_failure_reason = "bad huffman code";
  goto LAB_00171265;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}